

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  uint uVar58;
  uint uVar59;
  uint uVar60;
  int iVar61;
  uint uVar62;
  ulong uVar63;
  long lVar65;
  byte bVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  long lVar70;
  bool bVar71;
  float fVar72;
  vint4 bi_2;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined4 uVar73;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar107;
  float fVar125;
  float fVar126;
  vint4 bi;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar127;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar128;
  float fVar145;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar146;
  float fVar162;
  float fVar163;
  vint4 ai_2;
  undefined1 auVar147 [16];
  float fVar164;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar165;
  float fVar180;
  float fVar181;
  vint4 ai_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar182;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar183;
  float fVar184;
  undefined1 auVar179 [32];
  undefined8 uVar185;
  float fVar208;
  vint4 ai;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar200 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar207;
  float fVar209;
  undefined1 auVar206 [32];
  float fVar213;
  float fVar230;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar237 [16];
  undefined1 auVar250 [32];
  float fVar251;
  float fVar263;
  __m128 a;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  float fVar276;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar277;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar308 [16];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  float fVar317;
  float fVar328;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [32];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_669;
  undefined1 local_668 [16];
  undefined1 local_658 [8];
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_640;
  undefined1 local_628 [8];
  float fStack_620;
  float fStack_61c;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 *local_488;
  Primitive *local_480;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [32];
  uint auStack_3e8 [4];
  RTCFilterFunctionNArguments local_3d8;
  undefined1 local_3a8 [32];
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  uint local_348;
  uint uStack_344;
  uint uStack_340;
  uint uStack_33c;
  uint local_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [32];
  uint uStack_248;
  float afStack_244 [7];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar64;
  undefined1 auVar142 [32];
  
  PVar4 = prim[1];
  uVar63 = (ulong)(byte)PVar4;
  lVar65 = uVar63 * 0x25;
  fVar72 = *(float *)(prim + lVar65 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + lVar65 + 6));
  auVar74._0_4_ = fVar72 * auVar12._0_4_;
  auVar74._4_4_ = fVar72 * auVar12._4_4_;
  auVar74._8_4_ = fVar72 * auVar12._8_4_;
  auVar74._12_4_ = fVar72 * auVar12._12_4_;
  auVar108._0_4_ = fVar72 * auVar87._0_4_;
  auVar108._4_4_ = fVar72 * auVar87._4_4_;
  auVar108._8_4_ = fVar72 * auVar87._8_4_;
  auVar108._12_4_ = fVar72 * auVar87._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar116 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar63 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar190 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar318._4_4_ = auVar108._0_4_;
  auVar318._0_4_ = auVar108._0_4_;
  auVar318._8_4_ = auVar108._0_4_;
  auVar318._12_4_ = auVar108._0_4_;
  auVar17 = vshufps_avx(auVar108,auVar108,0x55);
  auVar217 = vshufps_avx(auVar108,auVar108,0xaa);
  fVar72 = auVar217._0_4_;
  auVar264._0_4_ = fVar72 * auVar116._0_4_;
  fVar165 = auVar217._4_4_;
  auVar264._4_4_ = fVar165 * auVar116._4_4_;
  fVar180 = auVar217._8_4_;
  auVar264._8_4_ = fVar180 * auVar116._8_4_;
  fVar181 = auVar217._12_4_;
  auVar264._12_4_ = fVar181 * auVar116._12_4_;
  auVar252._0_4_ = auVar15._0_4_ * fVar72;
  auVar252._4_4_ = auVar15._4_4_ * fVar165;
  auVar252._8_4_ = auVar15._8_4_ * fVar180;
  auVar252._12_4_ = auVar15._12_4_ * fVar181;
  auVar231._0_4_ = auVar190._0_4_ * fVar72;
  auVar231._4_4_ = auVar190._4_4_ * fVar165;
  auVar231._8_4_ = auVar190._8_4_ * fVar180;
  auVar231._12_4_ = auVar190._12_4_ * fVar181;
  auVar217 = vfmadd231ps_fma(auVar264,auVar17,auVar87);
  auVar265 = vfmadd231ps_fma(auVar252,auVar17,auVar14);
  auVar17 = vfmadd231ps_fma(auVar231,auVar131,auVar17);
  auVar76 = vfmadd231ps_fma(auVar217,auVar318,auVar12);
  auVar265 = vfmadd231ps_fma(auVar265,auVar318,auVar13);
  auVar77 = vfmadd231ps_fma(auVar17,auVar16,auVar318);
  auVar319._4_4_ = auVar74._0_4_;
  auVar319._0_4_ = auVar74._0_4_;
  auVar319._8_4_ = auVar74._0_4_;
  auVar319._12_4_ = auVar74._0_4_;
  auVar17 = vshufps_avx(auVar74,auVar74,0x55);
  auVar217 = vshufps_avx(auVar74,auVar74,0xaa);
  fVar72 = auVar217._0_4_;
  auVar109._0_4_ = fVar72 * auVar116._0_4_;
  fVar165 = auVar217._4_4_;
  auVar109._4_4_ = fVar165 * auVar116._4_4_;
  fVar180 = auVar217._8_4_;
  auVar109._8_4_ = fVar180 * auVar116._8_4_;
  fVar181 = auVar217._12_4_;
  auVar109._12_4_ = fVar181 * auVar116._12_4_;
  auVar90._0_4_ = auVar15._0_4_ * fVar72;
  auVar90._4_4_ = auVar15._4_4_ * fVar165;
  auVar90._8_4_ = auVar15._8_4_ * fVar180;
  auVar90._12_4_ = auVar15._12_4_ * fVar181;
  auVar75._0_4_ = auVar190._0_4_ * fVar72;
  auVar75._4_4_ = auVar190._4_4_ * fVar165;
  auVar75._8_4_ = auVar190._8_4_ * fVar180;
  auVar75._12_4_ = auVar190._12_4_ * fVar181;
  auVar87 = vfmadd231ps_fma(auVar109,auVar17,auVar87);
  auVar116 = vfmadd231ps_fma(auVar90,auVar17,auVar14);
  auVar14 = vfmadd231ps_fma(auVar75,auVar17,auVar131);
  auVar90 = vfmadd231ps_fma(auVar87,auVar319,auVar12);
  auVar91 = vfmadd231ps_fma(auVar116,auVar319,auVar13);
  auVar240 = vfmadd231ps_fma(auVar14,auVar319,auVar16);
  auVar320._8_4_ = 0x7fffffff;
  auVar320._0_8_ = 0x7fffffff7fffffff;
  auVar320._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar76,auVar320);
  auVar186._8_4_ = 0x219392ef;
  auVar186._0_8_ = 0x219392ef219392ef;
  auVar186._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar186,1);
  auVar87 = vblendvps_avx(auVar76,auVar186,auVar12);
  auVar12 = vandps_avx(auVar265,auVar320);
  auVar12 = vcmpps_avx(auVar12,auVar186,1);
  auVar116 = vblendvps_avx(auVar265,auVar186,auVar12);
  auVar12 = vandps_avx(auVar77,auVar320);
  auVar12 = vcmpps_avx(auVar12,auVar186,1);
  auVar12 = vblendvps_avx(auVar77,auVar186,auVar12);
  auVar13 = vrcpps_avx(auVar87);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = &DAT_3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar87 = vfnmadd213ps_fma(auVar87,auVar13,auVar214);
  auVar76 = vfmadd132ps_fma(auVar87,auVar13,auVar13);
  auVar87 = vrcpps_avx(auVar116);
  auVar116 = vfnmadd213ps_fma(auVar116,auVar87,auVar214);
  auVar77 = vfmadd132ps_fma(auVar116,auVar87,auVar87);
  auVar87 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar87,auVar214);
  auVar74 = vfmadd132ps_fma(auVar12,auVar87,auVar87);
  fVar72 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar65 + 0x16)) *
           *(float *)(prim + lVar65 + 0x1a);
  auVar187._4_4_ = fVar72;
  auVar187._0_4_ = fVar72;
  auVar187._8_4_ = fVar72;
  auVar187._12_4_ = fVar72;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar87 = vpmovsxwd_avx(auVar87);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar13 = vsubps_avx(auVar87,auVar12);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar87 = vpmovsxwd_avx(auVar116);
  auVar75 = vfmadd213ps_fma(auVar13,auVar187,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar116 = vpmovsxwd_avx(auVar13);
  auVar12 = vcvtdq2ps_avx(auVar87);
  auVar87 = vcvtdq2ps_avx(auVar116);
  auVar87 = vsubps_avx(auVar87,auVar12);
  auVar13 = vfmadd213ps_fma(auVar87,auVar187,auVar12);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar12 = vpmovsxwd_avx(auVar14);
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar69 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar63 * 2 + uVar69 + 6);
  auVar87 = vpmovsxwd_avx(auVar15);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar116 = vsubps_avx(auVar87,auVar12);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar87 = vpmovsxwd_avx(auVar16);
  auVar116 = vfmadd213ps_fma(auVar116,auVar187,auVar12);
  auVar12 = vcvtdq2ps_avx(auVar87);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar87 = vpmovsxwd_avx(auVar131);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar12);
  auVar14 = vfmadd213ps_fma(auVar87,auVar187,auVar12);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar12 = vpmovsxwd_avx(auVar190);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar63 + (ulong)(byte)PVar4 * 0x20 + 6);
  auVar87 = vpmovsxwd_avx(auVar17);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar12);
  auVar15 = vfmadd213ps_fma(auVar87,auVar187,auVar12);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar4 * 0x20 - uVar63) + 6);
  auVar12 = vpmovsxwd_avx(auVar217);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar87 = vpmovsxwd_avx(auVar265);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar12);
  auVar87 = vfmadd213ps_fma(auVar87,auVar187,auVar12);
  auVar12 = vsubps_avx(auVar75,auVar90);
  auVar188._0_4_ = auVar76._0_4_ * auVar12._0_4_;
  auVar188._4_4_ = auVar76._4_4_ * auVar12._4_4_;
  auVar188._8_4_ = auVar76._8_4_ * auVar12._8_4_;
  auVar188._12_4_ = auVar76._12_4_ * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar13,auVar90);
  auVar78._0_4_ = auVar76._0_4_ * auVar12._0_4_;
  auVar78._4_4_ = auVar76._4_4_ * auVar12._4_4_;
  auVar78._8_4_ = auVar76._8_4_ * auVar12._8_4_;
  auVar78._12_4_ = auVar76._12_4_ * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar116,auVar91);
  auVar166._0_4_ = auVar77._0_4_ * auVar12._0_4_;
  auVar166._4_4_ = auVar77._4_4_ * auVar12._4_4_;
  auVar166._8_4_ = auVar77._8_4_ * auVar12._8_4_;
  auVar166._12_4_ = auVar77._12_4_ * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar14,auVar91);
  auVar91._0_4_ = auVar77._0_4_ * auVar12._0_4_;
  auVar91._4_4_ = auVar77._4_4_ * auVar12._4_4_;
  auVar91._8_4_ = auVar77._8_4_ * auVar12._8_4_;
  auVar91._12_4_ = auVar77._12_4_ * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar15,auVar240);
  auVar147._0_4_ = auVar74._0_4_ * auVar12._0_4_;
  auVar147._4_4_ = auVar74._4_4_ * auVar12._4_4_;
  auVar147._8_4_ = auVar74._8_4_ * auVar12._8_4_;
  auVar147._12_4_ = auVar74._12_4_ * auVar12._12_4_;
  auVar12 = vsubps_avx(auVar87,auVar240);
  auVar76._0_4_ = auVar74._0_4_ * auVar12._0_4_;
  auVar76._4_4_ = auVar74._4_4_ * auVar12._4_4_;
  auVar76._8_4_ = auVar74._8_4_ * auVar12._8_4_;
  auVar76._12_4_ = auVar74._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar188,auVar78);
  auVar87 = vpminsd_avx(auVar166,auVar91);
  auVar12 = vmaxps_avx(auVar12,auVar87);
  auVar87 = vpminsd_avx(auVar147,auVar76);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar232._4_4_ = uVar73;
  auVar232._0_4_ = uVar73;
  auVar232._8_4_ = uVar73;
  auVar232._12_4_ = uVar73;
  auVar87 = vmaxps_avx(auVar87,auVar232);
  auVar12 = vmaxps_avx(auVar12,auVar87);
  local_328._0_4_ = auVar12._0_4_ * 0.99999964;
  local_328._4_4_ = auVar12._4_4_ * 0.99999964;
  local_328._8_4_ = auVar12._8_4_ * 0.99999964;
  local_328._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar188,auVar78);
  auVar87 = vpmaxsd_avx(auVar166,auVar91);
  auVar12 = vminps_avx(auVar12,auVar87);
  auVar87 = vpmaxsd_avx(auVar147,auVar76);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar152._4_4_ = uVar73;
  auVar152._0_4_ = uVar73;
  auVar152._8_4_ = uVar73;
  auVar152._12_4_ = uVar73;
  auVar87 = vminps_avx(auVar87,auVar152);
  auVar12 = vminps_avx(auVar12,auVar87);
  auVar77._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar77._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar77._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar77._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar240._1_3_ = 0;
  auVar240[0] = PVar4;
  auVar240[4] = PVar4;
  auVar240._5_3_ = 0;
  auVar240[8] = PVar4;
  auVar240._9_3_ = 0;
  auVar240[0xc] = PVar4;
  auVar240._13_3_ = 0;
  auVar87 = vpcmpgtd_avx(auVar240,_DAT_01ff0cf0);
  auVar12 = vcmpps_avx(local_328,auVar77,2);
  auVar12 = vandps_avx(auVar12,auVar87);
  uVar58 = vmovmskps_avx(auVar12);
  local_669 = uVar58 != 0;
  if (uVar58 == 0) {
    return local_669;
  }
  uVar58 = uVar58 & 0xff;
  auVar89._16_16_ = mm_lookupmask_ps._240_16_;
  auVar89._0_16_ = mm_lookupmask_ps._240_16_;
  local_268 = vblendps_avx(auVar89,ZEXT832(0) << 0x20,0x80);
  local_488 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_480 = prim;
LAB_01761a73:
  lVar65 = 0;
  for (uVar63 = (ulong)uVar58; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    lVar65 = lVar65 + 1;
  }
  uVar62 = *(uint *)(local_480 + 2);
  local_348 = *(uint *)(local_480 + lVar65 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar62].ptr;
  fVar72 = (pGVar5->time_range).lower;
  fVar72 = pGVar5->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar72) / ((pGVar5->time_range).upper - fVar72));
  auVar12 = vroundss_avx(ZEXT416((uint)fVar72),ZEXT416((uint)fVar72),9);
  auVar12 = vminss_avx(auVar12,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar217 = vmaxss_avx(ZEXT816(0),auVar12);
  uVar63 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)local_348 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar70 = (long)(int)auVar217._0_4_ * 0x38;
  lVar7 = *(long *)(_Var6 + lVar70);
  lVar8 = *(long *)(_Var6 + 0x10 + lVar70);
  auVar12 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar63);
  lVar65 = uVar63 + 1;
  auVar87 = *(undefined1 (*) [16])(lVar7 + lVar8 * lVar65);
  lVar1 = uVar63 + 2;
  auVar116 = *(undefined1 (*) [16])(lVar7 + lVar8 * lVar1);
  lVar2 = uVar63 + 3;
  auVar13 = *(undefined1 (*) [16])(lVar7 + lVar8 * lVar2);
  lVar7 = *(long *)&pGVar5[4].fnumTimeSegments;
  lVar8 = *(long *)(lVar7 + lVar70);
  lVar9 = *(long *)(lVar7 + 0x10 + lVar70);
  auVar14 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar63);
  auVar15 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar65);
  auVar16 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar1);
  auVar131 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar2);
  auVar265 = ZEXT816(0) << 0x40;
  auVar329._0_4_ = auVar13._0_4_ * 0.0;
  auVar329._4_4_ = auVar13._4_4_ * 0.0;
  auVar329._8_4_ = auVar13._8_4_ * 0.0;
  auVar329._12_4_ = auVar13._12_4_ * 0.0;
  auVar17 = vfmadd231ps_fma(auVar329,auVar116,auVar265);
  auVar190 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar87,auVar17);
  local_5c8 = auVar190._0_4_;
  fStack_5c4 = auVar190._4_4_;
  fStack_5c0 = auVar190._8_4_;
  fStack_5bc = auVar190._12_4_;
  auVar293._8_4_ = 0x40400000;
  auVar293._0_8_ = 0x4040000040400000;
  auVar293._12_4_ = 0x40400000;
  auVar190 = vfmadd231ps_fma(auVar17,auVar87,auVar293);
  auVar152 = vfnmadd231ps_fma(auVar190,auVar12,auVar293);
  auVar215._0_4_ = auVar131._0_4_ * 0.0;
  auVar215._4_4_ = auVar131._4_4_ * 0.0;
  auVar215._8_4_ = auVar131._8_4_ * 0.0;
  auVar215._12_4_ = auVar131._12_4_ * 0.0;
  auVar17 = vfmadd231ps_fma(auVar215,auVar16,auVar265);
  auVar190 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar15,auVar17);
  auVar253._0_4_ = auVar14._0_4_ + auVar190._0_4_;
  auVar253._4_4_ = auVar14._4_4_ + auVar190._4_4_;
  auVar253._8_4_ = auVar14._8_4_ + auVar190._8_4_;
  auVar253._12_4_ = auVar14._12_4_ + auVar190._12_4_;
  auVar190 = vfmadd231ps_fma(auVar17,auVar15,auVar293);
  auVar17 = vfnmadd231ps_fma(auVar190,auVar14,auVar293);
  auVar77 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar116,auVar13);
  auVar129._0_4_ = auVar13._0_4_ * 3.0;
  auVar129._4_4_ = auVar13._4_4_ * 3.0;
  auVar129._8_4_ = auVar13._8_4_ * 3.0;
  auVar129._12_4_ = auVar13._12_4_ * 3.0;
  auVar116 = vfnmadd231ps_fma(auVar129,auVar293,auVar116);
  auVar116 = vfmadd231ps_fma(auVar116,auVar265,auVar87);
  auVar147 = vfnmadd231ps_fma(auVar116,auVar265,auVar12);
  auVar116 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar16,auVar131);
  auVar116 = vfmadd231ps_fma(auVar116,auVar15,auVar265);
  auVar190 = vfmadd231ps_fma(auVar116,auVar14,auVar265);
  auVar233._0_4_ = auVar131._0_4_ * 3.0;
  auVar233._4_4_ = auVar131._4_4_ * 3.0;
  auVar233._8_4_ = auVar131._8_4_ * 3.0;
  auVar233._12_4_ = auVar131._12_4_ * 3.0;
  auVar116 = vfnmadd231ps_fma(auVar233,auVar293,auVar16);
  auVar116 = vfmadd231ps_fma(auVar116,auVar265,auVar15);
  auVar14 = vfnmadd231ps_fma(auVar116,auVar265,auVar14);
  auVar116 = vshufps_avx(auVar152,auVar152,0xc9);
  auVar13 = vshufps_avx(auVar253,auVar253,0xc9);
  fVar211 = auVar152._0_4_;
  auVar189._0_4_ = fVar211 * auVar13._0_4_;
  fVar280 = auVar152._4_4_;
  auVar189._4_4_ = fVar280 * auVar13._4_4_;
  fVar212 = auVar152._8_4_;
  auVar189._8_4_ = fVar212 * auVar13._8_4_;
  fVar213 = auVar152._12_4_;
  auVar189._12_4_ = fVar213 * auVar13._12_4_;
  auVar75 = vfmsub231ps_fma(auVar189,auVar116,auVar253);
  auVar13 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar92._0_4_ = fVar211 * auVar13._0_4_;
  auVar92._4_4_ = fVar280 * auVar13._4_4_;
  auVar92._8_4_ = fVar212 * auVar13._8_4_;
  auVar92._12_4_ = fVar213 * auVar13._12_4_;
  auVar90 = vfmsub231ps_fma(auVar92,auVar116,auVar17);
  auVar116 = vshufps_avx(auVar147,auVar147,0xc9);
  auVar13 = vshufps_avx(auVar190,auVar190,0xc9);
  fVar128 = auVar147._0_4_;
  auVar93._0_4_ = fVar128 * auVar13._0_4_;
  fVar145 = auVar147._4_4_;
  auVar93._4_4_ = fVar145 * auVar13._4_4_;
  fVar183 = auVar147._8_4_;
  auVar93._8_4_ = fVar183 * auVar13._8_4_;
  fVar184 = auVar147._12_4_;
  auVar93._12_4_ = fVar184 * auVar13._12_4_;
  auVar91 = vfmsub231ps_fma(auVar93,auVar116,auVar190);
  auVar13 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar94._0_4_ = fVar128 * auVar13._0_4_;
  auVar94._4_4_ = fVar145 * auVar13._4_4_;
  auVar94._8_4_ = fVar183 * auVar13._8_4_;
  auVar94._12_4_ = fVar184 * auVar13._12_4_;
  auVar240 = vfmsub231ps_fma(auVar94,auVar116,auVar14);
  lVar8 = *(long *)(_Var6 + 0x38 + lVar70);
  lVar9 = *(long *)(_Var6 + 0x48 + lVar70);
  auVar116 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar65);
  auVar13 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar1);
  auVar14 = *(undefined1 (*) [16])(lVar8 + lVar9 * lVar2);
  lVar10 = *(long *)(lVar7 + 0x38 + lVar70);
  lVar7 = *(long *)(lVar7 + 0x48 + lVar70);
  auVar234._0_4_ = auVar14._0_4_ * 0.0;
  auVar234._4_4_ = auVar14._4_4_ * 0.0;
  auVar234._8_4_ = auVar14._8_4_ * 0.0;
  auVar234._12_4_ = auVar14._12_4_ * 0.0;
  auVar15 = vfmadd231ps_fma(auVar234,auVar13,auVar265);
  auVar74 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar116,auVar15);
  auVar16 = vfmadd231ps_fma(auVar15,auVar116,auVar293);
  auVar15 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar63);
  auVar166 = vfnmadd231ps_fma(auVar16,auVar15,auVar293);
  auVar16 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar7);
  auVar131 = *(undefined1 (*) [16])(lVar10 + lVar7 * lVar2);
  auVar305._0_4_ = auVar131._0_4_ * 0.0;
  auVar305._4_4_ = auVar131._4_4_ * 0.0;
  auVar305._8_4_ = auVar131._8_4_ * 0.0;
  auVar305._12_4_ = auVar131._12_4_ * 0.0;
  auVar76 = vfmadd231ps_fma(auVar305,auVar16,auVar265);
  auVar190 = *(undefined1 (*) [16])(lVar10 + lVar65 * lVar7);
  auVar265 = vfmadd213ps_fma(auVar265,auVar190,auVar76);
  auVar17 = *(undefined1 (*) [16])(lVar10 + uVar63 * lVar7);
  auVar281._0_4_ = auVar265._0_4_ + auVar17._0_4_;
  auVar281._4_4_ = auVar265._4_4_ + auVar17._4_4_;
  auVar281._8_4_ = auVar265._8_4_ + auVar17._8_4_;
  auVar281._12_4_ = auVar265._12_4_ + auVar17._12_4_;
  auVar265 = vshufps_avx(auVar281,auVar281,0xc9);
  fVar207 = auVar166._0_4_;
  auVar266._0_4_ = fVar207 * auVar265._0_4_;
  fVar276 = auVar166._4_4_;
  auVar266._4_4_ = fVar276 * auVar265._4_4_;
  fVar208 = auVar166._8_4_;
  auVar266._8_4_ = fVar208 * auVar265._8_4_;
  fVar277 = auVar166._12_4_;
  auVar266._12_4_ = fVar277 * auVar265._12_4_;
  auVar265 = vshufps_avx(auVar166,auVar166,0xc9);
  auVar108 = vfmsub231ps_fma(auVar266,auVar265,auVar281);
  auVar76 = vfmadd231ps_fma(auVar76,auVar190,auVar293);
  auVar109 = vfnmadd231ps_fma(auVar76,auVar17,auVar293);
  auVar76 = vshufps_avx(auVar109,auVar109,0xc9);
  auVar267._0_4_ = fVar207 * auVar76._0_4_;
  auVar267._4_4_ = fVar276 * auVar76._4_4_;
  auVar267._8_4_ = fVar208 * auVar76._8_4_;
  auVar267._12_4_ = fVar277 * auVar76._12_4_;
  auVar76 = vfmsub231ps_fma(auVar267,auVar265,auVar109);
  auVar265 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar13,auVar14);
  auVar321._0_4_ = auVar14._0_4_ * 3.0;
  auVar321._4_4_ = auVar14._4_4_ * 3.0;
  auVar321._8_4_ = auVar14._8_4_ * 3.0;
  auVar321._12_4_ = auVar14._12_4_ * 3.0;
  auVar109 = vfnmadd231ps_fma(auVar321,auVar293,auVar13);
  auVar13 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar16,auVar131);
  auVar130._0_4_ = auVar131._0_4_ * 3.0;
  auVar130._4_4_ = auVar131._4_4_ * 3.0;
  auVar130._8_4_ = auVar131._8_4_ * 3.0;
  auVar130._12_4_ = auVar131._12_4_ * 3.0;
  auVar14 = vfnmadd231ps_fma(auVar130,auVar293,auVar16);
  auVar78 = ZEXT816(0) << 0x20;
  auVar13 = vfmadd231ps_fma(auVar13,auVar190,auVar78);
  auVar14 = vfmadd231ps_fma(auVar14,auVar78,auVar190);
  auVar16 = vfmadd231ps_fma(auVar13,auVar17,auVar78);
  auVar131 = vfnmadd231ps_fma(auVar14,auVar78,auVar17);
  auVar13 = vfmadd231ps_fma(auVar109,auVar78,auVar116);
  auVar186 = vfnmadd231ps_fma(auVar13,auVar78,auVar15);
  auVar13 = vshufps_avx(auVar16,auVar16,0xc9);
  fVar209 = auVar186._0_4_;
  auVar79._0_4_ = fVar209 * auVar13._0_4_;
  fVar278 = auVar186._4_4_;
  auVar79._4_4_ = fVar278 * auVar13._4_4_;
  fVar210 = auVar186._8_4_;
  auVar79._8_4_ = fVar210 * auVar13._8_4_;
  fVar279 = auVar186._12_4_;
  auVar79._12_4_ = fVar279 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar109 = vfmsub231ps_fma(auVar79,auVar13,auVar16);
  auVar14 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar80._0_4_ = fVar209 * auVar14._0_4_;
  auVar80._4_4_ = fVar278 * auVar14._4_4_;
  auVar80._8_4_ = fVar210 * auVar14._8_4_;
  auVar80._12_4_ = fVar279 * auVar14._12_4_;
  auVar78 = vfmsub231ps_fma(auVar80,auVar13,auVar131);
  fVar72 = fVar72 - auVar217._0_4_;
  auVar14 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar13 = vdpps_avx(auVar14,auVar14,0x7f);
  auVar48._12_4_ = 0;
  auVar48._0_12_ = ZEXT812(0);
  auVar87 = vfmadd231ps_fma(auVar77,auVar48 << 0x20,auVar87);
  auVar294._0_4_ = auVar12._0_4_ + local_5c8;
  auVar294._4_4_ = auVar12._4_4_ + fStack_5c4;
  auVar294._8_4_ = auVar12._8_4_ + fStack_5c0;
  auVar294._12_4_ = auVar12._12_4_ + fStack_5bc;
  auVar190 = vfmadd231ps_fma(auVar87,auVar12,auVar48 << 0x20);
  fVar165 = auVar13._0_4_;
  auVar131 = ZEXT416((uint)fVar165);
  auVar12 = vrsqrtss_avx(auVar131,auVar131);
  fVar180 = auVar12._0_4_;
  fVar181 = fVar180 * 1.5 - fVar165 * 0.5 * fVar180 * fVar180 * fVar180;
  auVar87 = vpermilps_avx(auVar90,0xc9);
  auVar12 = vdpps_avx(auVar14,auVar87,0x7f);
  auVar216._0_4_ = fVar165 * auVar87._0_4_;
  auVar216._4_4_ = fVar165 * auVar87._4_4_;
  auVar216._8_4_ = fVar165 * auVar87._8_4_;
  auVar216._12_4_ = fVar165 * auVar87._12_4_;
  fVar165 = auVar12._0_4_;
  auVar254._0_4_ = fVar165 * auVar14._0_4_;
  auVar254._4_4_ = fVar165 * auVar14._4_4_;
  auVar254._8_4_ = fVar165 * auVar14._8_4_;
  auVar254._12_4_ = fVar165 * auVar14._12_4_;
  auVar16 = vsubps_avx(auVar216,auVar254);
  auVar12 = vrcpss_avx(auVar131,auVar131);
  auVar87 = vfnmadd213ss_fma(auVar13,auVar12,SUB6416(ZEXT464(0x40000000),0));
  fVar165 = auVar12._0_4_ * auVar87._0_4_;
  auVar131 = vpermilps_avx(auVar91,0xc9);
  auVar87 = vdpps_avx(auVar131,auVar131,0x7f);
  fVar146 = auVar14._0_4_ * fVar181;
  fVar162 = auVar14._4_4_ * fVar181;
  fVar163 = auVar14._8_4_ * fVar181;
  fVar164 = auVar14._12_4_ * fVar181;
  auVar14 = vpermilps_avx(auVar240,0xc9);
  auVar12 = vblendps_avx(auVar87,_DAT_01feba10,0xe);
  auVar13 = vrsqrtss_avx(auVar12,auVar12);
  fVar180 = auVar87._0_4_;
  fVar182 = auVar13._0_4_;
  auVar13 = vdpps_avx(auVar131,auVar14,0x7f);
  fVar182 = fVar182 * 1.5 - fVar182 * fVar180 * 0.5 * fVar182 * fVar182;
  auVar95._0_4_ = fVar180 * auVar14._0_4_;
  auVar95._4_4_ = fVar180 * auVar14._4_4_;
  auVar95._8_4_ = fVar180 * auVar14._8_4_;
  auVar95._12_4_ = fVar180 * auVar14._12_4_;
  fVar180 = auVar13._0_4_;
  auVar110._0_4_ = auVar131._0_4_ * fVar180;
  auVar110._4_4_ = auVar131._4_4_ * fVar180;
  auVar110._8_4_ = auVar131._8_4_ * fVar180;
  auVar110._12_4_ = auVar131._12_4_ * fVar180;
  auVar13 = vsubps_avx(auVar95,auVar110);
  auVar12 = vrcpss_avx(auVar12,auVar12);
  auVar87 = vfnmadd213ss_fma(auVar87,auVar12,ZEXT416(0x40000000));
  fVar180 = auVar12._0_4_ * auVar87._0_4_;
  fVar107 = auVar131._0_4_ * fVar182;
  fVar125 = auVar131._4_4_ * fVar182;
  fVar126 = auVar131._8_4_ * fVar182;
  fVar127 = auVar131._12_4_ * fVar182;
  auVar12 = vshufps_avx(auVar152,auVar152,0xff);
  auVar87 = vshufps_avx(auVar294,auVar294,0xff);
  auVar148._0_4_ = auVar87._0_4_ * fVar146;
  auVar148._4_4_ = auVar87._4_4_ * fVar162;
  auVar148._8_4_ = auVar87._8_4_ * fVar163;
  auVar148._12_4_ = auVar87._12_4_ * fVar164;
  auVar132._0_4_ = auVar12._0_4_ * fVar146 + fVar181 * fVar165 * auVar16._0_4_ * auVar87._0_4_;
  auVar132._4_4_ = auVar12._4_4_ * fVar162 + fVar181 * fVar165 * auVar16._4_4_ * auVar87._4_4_;
  auVar132._8_4_ = auVar12._8_4_ * fVar163 + fVar181 * fVar165 * auVar16._8_4_ * auVar87._8_4_;
  auVar132._12_4_ = auVar12._12_4_ * fVar164 + fVar181 * fVar165 * auVar16._12_4_ * auVar87._12_4_;
  auVar14 = vsubps_avx(auVar294,auVar148);
  local_5a8._4_4_ = auVar294._4_4_ + auVar148._4_4_;
  local_5a8._0_4_ = auVar294._0_4_ + auVar148._0_4_;
  fStack_5a0 = auVar294._8_4_ + auVar148._8_4_;
  fStack_59c = auVar294._12_4_ + auVar148._12_4_;
  auVar16 = vsubps_avx(auVar152,auVar132);
  auVar12 = vshufps_avx(auVar147,auVar147,0xff);
  auVar87 = vshufps_avx(auVar190,auVar190,0xff);
  auVar111._0_4_ = auVar87._0_4_ * fVar107;
  auVar111._4_4_ = auVar87._4_4_ * fVar125;
  auVar111._8_4_ = auVar87._8_4_ * fVar126;
  auVar111._12_4_ = auVar87._12_4_ * fVar127;
  auVar81._0_4_ = auVar12._0_4_ * fVar107 + auVar87._0_4_ * fVar182 * auVar13._0_4_ * fVar180;
  auVar81._4_4_ = auVar12._4_4_ * fVar125 + auVar87._4_4_ * fVar182 * auVar13._4_4_ * fVar180;
  auVar81._8_4_ = auVar12._8_4_ * fVar126 + auVar87._8_4_ * fVar182 * auVar13._8_4_ * fVar180;
  auVar81._12_4_ = auVar12._12_4_ * fVar127 + auVar87._12_4_ * fVar182 * auVar13._12_4_ * fVar180;
  auVar13 = vsubps_avx(auVar190,auVar111);
  local_628._4_4_ = auVar190._4_4_ + auVar111._4_4_;
  local_628._0_4_ = auVar190._0_4_ + auVar111._0_4_;
  fStack_620 = auVar190._8_4_ + auVar111._8_4_;
  fStack_61c = auVar190._12_4_ + auVar111._12_4_;
  auVar131 = vsubps_avx(auVar147,auVar81);
  auVar49._12_4_ = 0;
  auVar49._0_12_ = ZEXT812(0);
  auVar12 = vfmadd231ps_fma(auVar265,auVar49 << 0x20,auVar116);
  local_508 = auVar74._0_4_;
  fStack_504 = auVar74._4_4_;
  fStack_500 = auVar74._8_4_;
  fStack_4fc = auVar74._12_4_;
  auVar255._0_4_ = auVar15._0_4_ + local_508;
  auVar255._4_4_ = auVar15._4_4_ + fStack_504;
  auVar255._8_4_ = auVar15._8_4_ + fStack_500;
  auVar255._12_4_ = auVar15._12_4_ + fStack_4fc;
  auVar17 = vfmadd231ps_fma(auVar12,auVar15,auVar49 << 0x20);
  auVar15 = vpermilps_avx(auVar108,0xc9);
  auVar12 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar165 = auVar12._0_4_;
  auVar190 = ZEXT416((uint)fVar165);
  auVar87 = vrsqrtss_avx(auVar190,auVar190);
  fVar180 = auVar87._0_4_;
  auVar116 = vpermilps_avx(auVar76,0xc9);
  auVar87 = vdpps_avx(auVar15,auVar116,0x7f);
  fVar181 = fVar180 * 1.5 - fVar165 * 0.5 * fVar180 * fVar180 * fVar180;
  auVar268._0_4_ = fVar165 * auVar116._0_4_;
  auVar268._4_4_ = fVar165 * auVar116._4_4_;
  auVar268._8_4_ = fVar165 * auVar116._8_4_;
  auVar268._12_4_ = fVar165 * auVar116._12_4_;
  fVar165 = auVar87._0_4_;
  auVar282._0_4_ = fVar165 * auVar15._0_4_;
  auVar282._4_4_ = fVar165 * auVar15._4_4_;
  auVar282._8_4_ = fVar165 * auVar15._8_4_;
  auVar282._12_4_ = fVar165 * auVar15._12_4_;
  auVar116 = vsubps_avx(auVar268,auVar282);
  auVar87 = vrcpss_avx(auVar190,auVar190);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar87,SUB6416(ZEXT464(0x40000000),0));
  fVar165 = auVar87._0_4_ * auVar12._0_4_;
  auVar190 = vpermilps_avx(auVar109,0xc9);
  auVar12 = vdpps_avx(auVar190,auVar190,0x7f);
  fVar107 = auVar15._0_4_ * fVar181;
  fVar125 = auVar15._4_4_ * fVar181;
  fVar126 = auVar15._8_4_ * fVar181;
  fVar127 = auVar15._12_4_ * fVar181;
  fVar180 = auVar12._0_4_;
  auVar217 = ZEXT416((uint)fVar180);
  auVar87 = vrsqrtss_avx(auVar217,auVar217);
  fVar182 = auVar87._0_4_;
  fVar182 = fVar182 * 1.5 - fVar180 * 0.5 * fVar182 * fVar182 * fVar182;
  auVar15 = vpermilps_avx(auVar78,0xc9);
  auVar87 = vdpps_avx(auVar190,auVar15,0x7f);
  auVar167._0_4_ = auVar15._0_4_ * fVar180;
  auVar167._4_4_ = auVar15._4_4_ * fVar180;
  auVar167._8_4_ = auVar15._8_4_ * fVar180;
  auVar167._12_4_ = auVar15._12_4_ * fVar180;
  fVar180 = auVar87._0_4_;
  auVar283._0_4_ = fVar180 * auVar190._0_4_;
  auVar283._4_4_ = fVar180 * auVar190._4_4_;
  auVar283._8_4_ = fVar180 * auVar190._8_4_;
  auVar283._12_4_ = fVar180 * auVar190._12_4_;
  auVar15 = vsubps_avx(auVar167,auVar283);
  auVar87 = vrcpss_avx(auVar217,auVar217);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar87,SUB6416(ZEXT464(0x40000000),0));
  fVar180 = auVar12._0_4_ * auVar87._0_4_;
  fVar146 = auVar190._0_4_ * fVar182;
  fVar162 = auVar190._4_4_ * fVar182;
  fVar163 = auVar190._8_4_ * fVar182;
  fVar164 = auVar190._12_4_ * fVar182;
  auVar12 = vshufps_avx(auVar166,auVar166,0xff);
  auVar87 = vshufps_avx(auVar255,auVar255,0xff);
  auVar82._0_4_ = auVar87._0_4_ * fVar107;
  auVar82._4_4_ = auVar87._4_4_ * fVar125;
  auVar82._8_4_ = auVar87._8_4_ * fVar126;
  auVar82._12_4_ = auVar87._12_4_ * fVar127;
  auVar168._0_4_ = auVar12._0_4_ * fVar107 + auVar87._0_4_ * fVar181 * auVar116._0_4_ * fVar165;
  auVar168._4_4_ = auVar12._4_4_ * fVar125 + auVar87._4_4_ * fVar181 * auVar116._4_4_ * fVar165;
  auVar168._8_4_ = auVar12._8_4_ * fVar126 + auVar87._8_4_ * fVar181 * auVar116._8_4_ * fVar165;
  auVar168._12_4_ = auVar12._12_4_ * fVar127 + auVar87._12_4_ * fVar181 * auVar116._12_4_ * fVar165;
  auVar116 = vsubps_avx(auVar255,auVar82);
  auVar190 = vsubps_avx(auVar166,auVar168);
  auVar12 = vshufps_avx(auVar186,auVar186,0xff);
  auVar87 = vshufps_avx(auVar17,auVar17,0xff);
  auVar218._0_4_ = auVar87._0_4_ * fVar146;
  auVar218._4_4_ = auVar87._4_4_ * fVar162;
  auVar218._8_4_ = auVar87._8_4_ * fVar163;
  auVar218._12_4_ = auVar87._12_4_ * fVar164;
  auVar133._0_4_ = auVar12._0_4_ * fVar146 + auVar87._0_4_ * fVar182 * auVar15._0_4_ * fVar180;
  auVar133._4_4_ = auVar12._4_4_ * fVar162 + auVar87._4_4_ * fVar182 * auVar15._4_4_ * fVar180;
  auVar133._8_4_ = auVar12._8_4_ * fVar163 + auVar87._8_4_ * fVar182 * auVar15._8_4_ * fVar180;
  auVar133._12_4_ = auVar12._12_4_ * fVar164 + auVar87._12_4_ * fVar182 * auVar15._12_4_ * fVar180;
  auVar12 = vsubps_avx(auVar17,auVar218);
  auVar330._0_4_ = auVar17._0_4_ + auVar218._0_4_;
  auVar330._4_4_ = auVar17._4_4_ + auVar218._4_4_;
  auVar330._8_4_ = auVar17._8_4_ + auVar218._8_4_;
  auVar330._12_4_ = auVar17._12_4_ + auVar218._12_4_;
  auVar87 = vsubps_avx(auVar186,auVar133);
  local_5e8._0_4_ = auVar16._0_4_;
  local_5e8._4_4_ = auVar16._4_4_;
  fStack_5e0 = auVar16._8_4_;
  fStack_5dc = auVar16._12_4_;
  auVar134._0_4_ = auVar14._0_4_ + (float)local_5e8._0_4_ * 0.33333334;
  auVar134._4_4_ = auVar14._4_4_ + (float)local_5e8._4_4_ * 0.33333334;
  auVar134._8_4_ = auVar14._8_4_ + fStack_5e0 * 0.33333334;
  auVar134._12_4_ = auVar14._12_4_ + fStack_5dc * 0.33333334;
  fVar165 = 1.0 - fVar72;
  auVar219._4_4_ = fVar165;
  auVar219._0_4_ = fVar165;
  auVar219._8_4_ = fVar165;
  auVar219._12_4_ = fVar165;
  auVar284._0_4_ = fVar72 * auVar116._0_4_;
  auVar284._4_4_ = fVar72 * auVar116._4_4_;
  auVar284._8_4_ = fVar72 * auVar116._8_4_;
  auVar284._12_4_ = fVar72 * auVar116._12_4_;
  local_448 = vfmadd231ps_fma(auVar284,auVar219,auVar14);
  auVar83._0_4_ = fVar72 * (auVar116._0_4_ + auVar190._0_4_ * 0.33333334);
  auVar83._4_4_ = fVar72 * (auVar116._4_4_ + auVar190._4_4_ * 0.33333334);
  auVar83._8_4_ = fVar72 * (auVar116._8_4_ + auVar190._8_4_ * 0.33333334);
  auVar83._12_4_ = fVar72 * (auVar116._12_4_ + auVar190._12_4_ * 0.33333334);
  auVar16 = vfmadd231ps_fma(auVar83,auVar219,auVar134);
  local_658._0_4_ = auVar131._0_4_;
  local_658._4_4_ = auVar131._4_4_;
  uStack_650._0_4_ = auVar131._8_4_;
  uStack_650._4_4_ = auVar131._12_4_;
  auVar96._0_4_ = (float)local_658._0_4_ * 0.33333334;
  auVar96._4_4_ = (float)local_658._4_4_ * 0.33333334;
  auVar96._8_4_ = (float)uStack_650 * 0.33333334;
  auVar96._12_4_ = uStack_650._4_4_ * 0.33333334;
  auVar116 = vsubps_avx(auVar13,auVar96);
  auVar306._0_4_ = auVar294._0_4_ + auVar148._0_4_ + (fVar211 + auVar132._0_4_) * 0.33333334;
  auVar306._4_4_ = auVar294._4_4_ + auVar148._4_4_ + (fVar280 + auVar132._4_4_) * 0.33333334;
  auVar306._8_4_ = auVar294._8_4_ + auVar148._8_4_ + (fVar212 + auVar132._8_4_) * 0.33333334;
  auVar306._12_4_ = auVar294._12_4_ + auVar148._12_4_ + (fVar213 + auVar132._12_4_) * 0.33333334;
  auVar285._0_4_ = (fVar128 + auVar81._0_4_) * 0.33333334;
  auVar285._4_4_ = (fVar145 + auVar81._4_4_) * 0.33333334;
  auVar285._8_4_ = (fVar183 + auVar81._8_4_) * 0.33333334;
  auVar285._12_4_ = (fVar184 + auVar81._12_4_) * 0.33333334;
  auVar14 = vsubps_avx(_local_628,auVar285);
  auVar169._0_4_ = auVar87._0_4_ * 0.33333334;
  auVar169._4_4_ = auVar87._4_4_ * 0.33333334;
  auVar169._8_4_ = auVar87._8_4_ * 0.33333334;
  auVar169._12_4_ = auVar87._12_4_ * 0.33333334;
  auVar87 = vsubps_avx(auVar12,auVar169);
  auVar256._0_4_ = (fVar209 + auVar133._0_4_) * 0.33333334;
  auVar256._4_4_ = (fVar278 + auVar133._4_4_) * 0.33333334;
  auVar256._8_4_ = (fVar210 + auVar133._8_4_) * 0.33333334;
  auVar256._12_4_ = (fVar279 + auVar133._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar330,auVar256);
  auVar322._0_4_ = fVar72 * auVar87._0_4_;
  auVar322._4_4_ = fVar72 * auVar87._4_4_;
  auVar322._8_4_ = fVar72 * auVar87._8_4_;
  auVar322._12_4_ = fVar72 * auVar87._12_4_;
  auVar235._0_4_ = fVar72 * auVar12._0_4_;
  auVar235._4_4_ = fVar72 * auVar12._4_4_;
  auVar235._8_4_ = fVar72 * auVar12._8_4_;
  auVar235._12_4_ = fVar72 * auVar12._12_4_;
  local_458 = vfmadd231ps_fma(auVar322,auVar219,auVar116);
  auVar131 = vfmadd231ps_fma(auVar235,auVar219,auVar13);
  auVar97._0_4_ = fVar72 * (auVar255._0_4_ + auVar82._0_4_);
  auVar97._4_4_ = fVar72 * (auVar255._4_4_ + auVar82._4_4_);
  auVar97._8_4_ = fVar72 * (auVar255._8_4_ + auVar82._8_4_);
  auVar97._12_4_ = fVar72 * (auVar255._12_4_ + auVar82._12_4_);
  auVar170._0_4_ =
       fVar72 * (auVar255._0_4_ + auVar82._0_4_ + (fVar207 + auVar168._0_4_) * 0.33333334);
  auVar170._4_4_ =
       fVar72 * (auVar255._4_4_ + auVar82._4_4_ + (fVar276 + auVar168._4_4_) * 0.33333334);
  auVar170._8_4_ =
       fVar72 * (auVar255._8_4_ + auVar82._8_4_ + (fVar208 + auVar168._8_4_) * 0.33333334);
  auVar170._12_4_ =
       fVar72 * (auVar255._12_4_ + auVar82._12_4_ + (fVar277 + auVar168._12_4_) * 0.33333334);
  auVar191._0_4_ = fVar72 * auVar15._0_4_;
  auVar191._4_4_ = fVar72 * auVar15._4_4_;
  auVar191._8_4_ = fVar72 * auVar15._8_4_;
  auVar191._12_4_ = fVar72 * auVar15._12_4_;
  auVar236._0_4_ = fVar72 * auVar330._0_4_;
  auVar236._4_4_ = fVar72 * auVar330._4_4_;
  auVar236._8_4_ = fVar72 * auVar330._8_4_;
  auVar236._12_4_ = fVar72 * auVar330._12_4_;
  _local_468 = vfmadd231ps_fma(auVar97,auVar219,_local_5a8);
  _local_478 = vfmadd231ps_fma(auVar170,auVar219,auVar306);
  auVar190 = vfmadd231ps_fma(auVar191,auVar219,auVar14);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar17 = vfmadd231ps_fma(auVar236,auVar219,_local_628);
  local_428 = vsubps_avx(local_448,auVar12);
  auVar87 = vshufps_avx(local_428,local_428,0x55);
  auVar116 = vshufps_avx(local_428,local_428,0xaa);
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar72 = pre->ray_space[k].vz.field_0.m128[0];
  fVar165 = pre->ray_space[k].vz.field_0.m128[1];
  fVar180 = pre->ray_space[k].vz.field_0.m128[2];
  fVar181 = pre->ray_space[k].vz.field_0.m128[3];
  auVar84._0_4_ = fVar72 * auVar116._0_4_;
  auVar84._4_4_ = fVar165 * auVar116._4_4_;
  auVar84._8_4_ = fVar180 * auVar116._8_4_;
  auVar84._12_4_ = fVar181 * auVar116._12_4_;
  auVar13 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar3,auVar87);
  local_438 = vsubps_avx(auVar16,auVar12);
  auVar87 = vshufps_avx(local_438,local_438,0x55);
  auVar116 = vshufps_avx(local_438,local_438,0xaa);
  auVar331._0_4_ = fVar72 * auVar116._0_4_;
  auVar331._4_4_ = fVar165 * auVar116._4_4_;
  auVar331._8_4_ = fVar180 * auVar116._8_4_;
  auVar331._12_4_ = fVar181 * auVar116._12_4_;
  auVar116 = vfmadd231ps_fma(auVar331,(undefined1  [16])aVar3,auVar87);
  local_2b8 = vsubps_avx(local_458,auVar12);
  auVar87 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar323._0_4_ = fVar72 * auVar87._0_4_;
  auVar323._4_4_ = fVar165 * auVar87._4_4_;
  auVar323._8_4_ = fVar180 * auVar87._8_4_;
  auVar323._12_4_ = fVar181 * auVar87._12_4_;
  auVar87 = vshufps_avx(local_2b8,local_2b8,0x55);
  auVar14 = vfmadd231ps_fma(auVar323,(undefined1  [16])aVar3,auVar87);
  local_2c8 = vsubps_avx(auVar131,auVar12);
  auVar87 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar307._0_4_ = fVar72 * auVar87._0_4_;
  auVar307._4_4_ = fVar165 * auVar87._4_4_;
  auVar307._8_4_ = fVar180 * auVar87._8_4_;
  auVar307._12_4_ = fVar181 * auVar87._12_4_;
  auVar87 = vshufps_avx(local_2c8,local_2c8,0x55);
  auVar15 = vfmadd231ps_fma(auVar307,(undefined1  [16])aVar3,auVar87);
  local_2d8 = vsubps_avx(_local_468,auVar12);
  auVar87 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar149._0_4_ = fVar72 * auVar87._0_4_;
  auVar149._4_4_ = fVar165 * auVar87._4_4_;
  auVar149._8_4_ = fVar180 * auVar87._8_4_;
  auVar149._12_4_ = fVar181 * auVar87._12_4_;
  auVar87 = vshufps_avx(local_2d8,local_2d8,0x55);
  auVar217 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar3,auVar87);
  local_2e8 = vsubps_avx(_local_478,auVar12);
  auVar87 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar220._0_4_ = fVar72 * auVar87._0_4_;
  auVar220._4_4_ = fVar165 * auVar87._4_4_;
  auVar220._8_4_ = fVar180 * auVar87._8_4_;
  auVar220._12_4_ = fVar181 * auVar87._12_4_;
  auVar87 = vshufps_avx(local_2e8,local_2e8,0x55);
  auVar265 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar3,auVar87);
  local_2f8 = vsubps_avx(auVar190,auVar12);
  auVar87 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar257._0_4_ = fVar72 * auVar87._0_4_;
  auVar257._4_4_ = fVar165 * auVar87._4_4_;
  auVar257._8_4_ = fVar180 * auVar87._8_4_;
  auVar257._12_4_ = fVar181 * auVar87._12_4_;
  auVar87 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar87 = vfmadd231ps_fma(auVar257,(undefined1  [16])aVar3,auVar87);
  local_308 = vsubps_avx(auVar17,auVar12);
  auVar12 = vshufps_avx(local_308,local_308,0xaa);
  auVar171._0_4_ = fVar72 * auVar12._0_4_;
  auVar171._4_4_ = fVar165 * auVar12._4_4_;
  auVar171._8_4_ = fVar180 * auVar12._8_4_;
  auVar171._12_4_ = fVar181 * auVar12._12_4_;
  auVar12 = vshufps_avx(local_308,local_308,0x55);
  auVar12 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar3,auVar12);
  auVar192._4_4_ = local_428._0_4_;
  auVar192._0_4_ = local_428._0_4_;
  auVar192._8_4_ = local_428._0_4_;
  auVar192._12_4_ = local_428._0_4_;
  aVar3 = pre->ray_space[k].vx.field_0;
  auVar76 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar192);
  auVar193._4_4_ = local_438._0_4_;
  auVar193._0_4_ = local_438._0_4_;
  auVar193._8_4_ = local_438._0_4_;
  auVar193._12_4_ = local_438._0_4_;
  auVar77 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar3,auVar193);
  uVar73 = local_2b8._0_4_;
  auVar194._4_4_ = uVar73;
  auVar194._0_4_ = uVar73;
  auVar194._8_4_ = uVar73;
  auVar194._12_4_ = uVar73;
  auVar74 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar3,auVar194);
  uVar73 = local_2c8._0_4_;
  auVar195._4_4_ = uVar73;
  auVar195._0_4_ = uVar73;
  auVar195._8_4_ = uVar73;
  auVar195._12_4_ = uVar73;
  auVar75 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar3,auVar195);
  uVar73 = local_2d8._0_4_;
  auVar196._4_4_ = uVar73;
  auVar196._0_4_ = uVar73;
  auVar196._8_4_ = uVar73;
  auVar196._12_4_ = uVar73;
  auVar217 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar3,auVar196);
  uVar73 = local_2e8._0_4_;
  auVar197._4_4_ = uVar73;
  auVar197._0_4_ = uVar73;
  auVar197._8_4_ = uVar73;
  auVar197._12_4_ = uVar73;
  auVar265 = vfmadd231ps_fma(auVar265,(undefined1  [16])aVar3,auVar197);
  uVar73 = local_2f8._0_4_;
  auVar198._4_4_ = uVar73;
  auVar198._0_4_ = uVar73;
  auVar198._8_4_ = uVar73;
  auVar198._12_4_ = uVar73;
  auVar90 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar3,auVar198);
  uVar73 = local_308._0_4_;
  auVar199._4_4_ = uVar73;
  auVar199._0_4_ = uVar73;
  auVar199._8_4_ = uVar73;
  auVar199._12_4_ = uVar73;
  auVar91 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar3,auVar199);
  auVar13 = vmovlhps_avx(auVar76,auVar217);
  auVar14 = vmovlhps_avx(auVar77,auVar265);
  auVar15 = vmovlhps_avx(auVar74,auVar90);
  _local_418 = vmovlhps_avx(auVar75,auVar91);
  auVar12 = vminps_avx(auVar13,auVar14);
  auVar87 = vminps_avx(auVar15,_local_418);
  auVar116 = vminps_avx(auVar12,auVar87);
  auVar12 = vmaxps_avx(auVar13,auVar14);
  auVar87 = vmaxps_avx(auVar15,_local_418);
  auVar12 = vmaxps_avx(auVar12,auVar87);
  auVar87 = vshufpd_avx(auVar116,auVar116,3);
  auVar116 = vminps_avx(auVar116,auVar87);
  auVar87 = vshufpd_avx(auVar12,auVar12,3);
  auVar87 = vmaxps_avx(auVar12,auVar87);
  auVar12 = vandps_avx(auVar116,auVar320);
  auVar87 = vandps_avx(auVar87,auVar320);
  auVar12 = vmaxps_avx(auVar12,auVar87);
  auVar87 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar87,auVar12);
  local_178 = auVar12._0_4_ * 9.536743e-07;
  auVar200._8_8_ = auVar76._0_8_;
  auVar200._0_8_ = auVar76._0_8_;
  auVar237._8_8_ = auVar77._0_8_;
  auVar237._0_8_ = auVar77._0_8_;
  auVar269._8_8_ = auVar74._0_8_;
  auVar269._0_8_ = auVar74._0_8_;
  auVar308._0_8_ = auVar75._0_8_;
  auVar308._8_8_ = auVar308._0_8_;
  local_2a8 = ZEXT416((uint)local_178);
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_168 = local_178;
  fStack_164 = local_178;
  fStack_160 = local_178;
  fStack_15c = local_178;
  local_198 = -local_178;
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_338 = uVar62;
  uStack_334 = uVar62;
  uStack_330 = uVar62;
  uStack_32c = uVar62;
  uStack_344 = local_348;
  uStack_340 = local_348;
  uStack_33c = local_348;
  uVar69 = 0;
  uVar63 = 0;
  fVar72 = *(float *)(ray + k * 4 + 0x30);
  local_278 = vsubps_avx(auVar14,auVar13);
  local_288 = vsubps_avx(auVar15,auVar14);
  local_298 = vsubps_avx(_local_418,auVar15);
  local_358 = vsubps_avx(_local_468,local_448);
  local_368 = vsubps_avx(_local_478,auVar16);
  local_378 = vsubps_avx(auVar190,local_458);
  _local_388 = vsubps_avx(auVar17,auVar131);
  local_668 = ZEXT816(0x3f80000000000000);
  local_318 = local_668;
  do {
    auVar12 = vshufps_avx(local_668,local_668,0x50);
    auVar135._8_4_ = 0x3f800000;
    auVar135._0_8_ = &DAT_3f8000003f800000;
    auVar135._12_4_ = 0x3f800000;
    auVar142._16_4_ = 0x3f800000;
    auVar142._0_16_ = auVar135;
    auVar142._20_4_ = 0x3f800000;
    auVar142._24_4_ = 0x3f800000;
    auVar142._28_4_ = 0x3f800000;
    auVar87 = vsubps_avx(auVar135,auVar12);
    fVar165 = auVar12._0_4_;
    fVar128 = auVar217._0_4_;
    auVar85._0_4_ = fVar128 * fVar165;
    fVar180 = auVar12._4_4_;
    fVar145 = auVar217._4_4_;
    auVar85._4_4_ = fVar145 * fVar180;
    fVar181 = auVar12._8_4_;
    auVar85._8_4_ = fVar128 * fVar181;
    fVar182 = auVar12._12_4_;
    auVar85._12_4_ = fVar145 * fVar182;
    fVar213 = auVar265._0_4_;
    auVar172._0_4_ = fVar213 * fVar165;
    fVar230 = auVar265._4_4_;
    auVar172._4_4_ = fVar230 * fVar180;
    auVar172._8_4_ = fVar213 * fVar181;
    auVar172._12_4_ = fVar230 * fVar182;
    fVar251 = auVar90._0_4_;
    auVar221._0_4_ = fVar251 * fVar165;
    fVar263 = auVar90._4_4_;
    auVar221._4_4_ = fVar263 * fVar180;
    auVar221._8_4_ = fVar251 * fVar181;
    auVar221._12_4_ = fVar263 * fVar182;
    fVar317 = auVar91._0_4_;
    auVar295._0_4_ = fVar317 * fVar165;
    fVar328 = auVar91._4_4_;
    auVar295._4_4_ = fVar328 * fVar180;
    auVar295._8_4_ = fVar317 * fVar181;
    auVar295._12_4_ = fVar328 * fVar182;
    auVar77 = vfmadd231ps_fma(auVar85,auVar87,auVar200);
    auVar74 = vfmadd231ps_fma(auVar172,auVar87,auVar237);
    auVar75 = vfmadd231ps_fma(auVar221,auVar87,auVar269);
    auVar240 = vfmadd231ps_fma(auVar295,auVar308,auVar87);
    local_5c8 = auVar240._0_4_;
    auVar12 = vmovshdup_avx(local_318);
    fVar165 = local_318._0_4_;
    fVar107 = (auVar12._0_4_ - fVar165) * 0.04761905;
    auVar250._4_4_ = fVar165;
    auVar250._0_4_ = fVar165;
    auVar250._8_4_ = fVar165;
    auVar250._12_4_ = fVar165;
    auVar250._16_4_ = fVar165;
    auVar250._20_4_ = fVar165;
    auVar250._24_4_ = fVar165;
    auVar250._28_4_ = fVar165;
    auVar122._0_8_ = auVar12._0_8_;
    auVar122._8_8_ = auVar122._0_8_;
    auVar122._16_8_ = auVar122._0_8_;
    auVar122._24_8_ = auVar122._0_8_;
    auVar89 = vsubps_avx(auVar122,auVar250);
    uVar73 = auVar77._0_4_;
    auVar335._4_4_ = uVar73;
    auVar335._0_4_ = uVar73;
    auVar335._8_4_ = uVar73;
    auVar335._12_4_ = uVar73;
    auVar335._16_4_ = uVar73;
    auVar335._20_4_ = uVar73;
    auVar335._24_4_ = uVar73;
    auVar335._28_4_ = uVar73;
    auVar12 = vmovshdup_avx(auVar77);
    uVar185 = auVar12._0_8_;
    auVar315._8_8_ = uVar185;
    auVar315._0_8_ = uVar185;
    auVar315._16_8_ = uVar185;
    auVar315._24_8_ = uVar185;
    fVar125 = auVar74._0_4_;
    auVar105._4_4_ = fVar125;
    auVar105._0_4_ = fVar125;
    auVar105._8_4_ = fVar125;
    auVar105._12_4_ = fVar125;
    auVar105._16_4_ = fVar125;
    auVar105._20_4_ = fVar125;
    auVar105._24_4_ = fVar125;
    auVar105._28_4_ = fVar125;
    auVar87 = vmovshdup_avx(auVar74);
    auVar204._0_8_ = auVar87._0_8_;
    auVar204._8_8_ = auVar204._0_8_;
    auVar204._16_8_ = auVar204._0_8_;
    auVar204._24_8_ = auVar204._0_8_;
    fVar183 = auVar75._0_4_;
    auVar292._4_4_ = fVar183;
    auVar292._0_4_ = fVar183;
    auVar292._8_4_ = fVar183;
    auVar292._12_4_ = fVar183;
    auVar292._16_4_ = fVar183;
    auVar292._20_4_ = fVar183;
    auVar292._24_4_ = fVar183;
    auVar292._28_4_ = fVar183;
    auVar116 = vmovshdup_avx(auVar75);
    auVar262._0_8_ = auVar116._0_8_;
    auVar262._8_8_ = auVar262._0_8_;
    auVar262._16_8_ = auVar262._0_8_;
    auVar262._24_8_ = auVar262._0_8_;
    auVar76 = vmovshdup_avx(auVar240);
    auVar108 = vfmadd132ps_fma(auVar89,auVar250,_DAT_02020f20);
    auVar89 = vsubps_avx(auVar142,ZEXT1632(auVar108));
    fVar165 = auVar108._0_4_;
    auVar325._0_4_ = fVar125 * fVar165;
    fVar180 = auVar108._4_4_;
    auVar325._4_4_ = fVar125 * fVar180;
    fVar181 = auVar108._8_4_;
    auVar325._8_4_ = fVar125 * fVar181;
    fVar182 = auVar108._12_4_;
    auVar325._12_4_ = fVar125 * fVar182;
    auVar325._16_4_ = fVar125 * 0.0;
    auVar325._20_4_ = fVar125 * 0.0;
    auVar325._24_4_ = fVar125 * 0.0;
    auVar325._28_4_ = 0;
    auVar108 = vfmadd231ps_fma(auVar325,auVar89,auVar335);
    fVar126 = auVar87._0_4_;
    auVar302._0_4_ = fVar126 * fVar165;
    fVar127 = auVar87._4_4_;
    auVar302._4_4_ = fVar127 * fVar180;
    auVar302._8_4_ = fVar126 * fVar181;
    auVar302._12_4_ = fVar127 * fVar182;
    auVar302._16_4_ = fVar126 * 0.0;
    auVar302._20_4_ = fVar127 * 0.0;
    auVar302._24_4_ = fVar126 * 0.0;
    auVar302._28_4_ = 0;
    auVar109 = vfmadd231ps_fma(auVar302,auVar89,auVar315);
    auVar18._4_4_ = fVar183 * fVar180;
    auVar18._0_4_ = fVar183 * fVar165;
    auVar18._8_4_ = fVar183 * fVar181;
    auVar18._12_4_ = fVar183 * fVar182;
    auVar18._16_4_ = fVar183 * 0.0;
    auVar18._20_4_ = fVar183 * 0.0;
    auVar18._24_4_ = fVar183 * 0.0;
    auVar18._28_4_ = auVar12._4_4_;
    auVar78 = vfmadd231ps_fma(auVar18,auVar89,auVar105);
    fVar126 = auVar116._0_4_;
    fVar127 = auVar116._4_4_;
    auVar19._4_4_ = fVar127 * fVar180;
    auVar19._0_4_ = fVar126 * fVar165;
    auVar19._8_4_ = fVar126 * fVar181;
    auVar19._12_4_ = fVar127 * fVar182;
    auVar19._16_4_ = fVar126 * 0.0;
    auVar19._20_4_ = fVar127 * 0.0;
    auVar19._24_4_ = fVar126 * 0.0;
    auVar19._28_4_ = uVar73;
    auVar152 = vfmadd231ps_fma(auVar19,auVar89,auVar204);
    auVar12 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar205._0_8_ = auVar12._0_8_;
    auVar205._8_8_ = auVar205._0_8_;
    auVar205._16_8_ = auVar205._0_8_;
    auVar205._24_8_ = auVar205._0_8_;
    auVar87 = vshufps_avx(auVar77,auVar77,0xff);
    uStack_650 = auVar87._0_8_;
    local_658 = (undefined1  [8])uStack_650;
    uStack_648 = uStack_650;
    uStack_640 = uStack_650;
    auVar20._4_4_ = fVar180 * local_5c8;
    auVar20._0_4_ = fVar165 * local_5c8;
    auVar20._8_4_ = fVar181 * local_5c8;
    auVar20._12_4_ = fVar182 * local_5c8;
    auVar20._16_4_ = local_5c8 * 0.0;
    auVar20._20_4_ = local_5c8 * 0.0;
    auVar20._24_4_ = local_5c8 * 0.0;
    auVar20._28_4_ = 0x3f800000;
    auVar147 = vfmadd231ps_fma(auVar20,auVar89,auVar292);
    auVar116 = vshufps_avx(auVar74,auVar74,0xaa);
    auVar160._0_8_ = auVar116._0_8_;
    auVar160._8_8_ = auVar160._0_8_;
    auVar160._16_8_ = auVar160._0_8_;
    auVar160._24_8_ = auVar160._0_8_;
    auVar77 = vshufps_avx(auVar74,auVar74,0xff);
    auVar179._0_8_ = auVar77._0_8_;
    auVar179._8_8_ = auVar179._0_8_;
    auVar179._16_8_ = auVar179._0_8_;
    auVar179._24_8_ = auVar179._0_8_;
    fVar126 = auVar76._0_4_;
    fVar127 = auVar76._4_4_;
    auVar21._4_4_ = fVar127 * fVar180;
    auVar21._0_4_ = fVar126 * fVar165;
    auVar21._8_4_ = fVar126 * fVar181;
    auVar21._12_4_ = fVar127 * fVar182;
    auVar21._16_4_ = fVar126 * 0.0;
    auVar21._20_4_ = fVar127 * 0.0;
    auVar21._24_4_ = fVar126 * 0.0;
    auVar21._28_4_ = fVar183;
    auVar166 = vfmadd231ps_fma(auVar21,auVar89,auVar262);
    auVar22._28_4_ = fVar125;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(auVar78._12_4_ * fVar182,
                            CONCAT48(auVar78._8_4_ * fVar181,
                                     CONCAT44(auVar78._4_4_ * fVar180,auVar78._0_4_ * fVar165))));
    auVar108 = vfmadd231ps_fma(auVar22,auVar89,ZEXT1632(auVar108));
    auVar23._28_4_ = auVar87._4_4_;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(auVar152._12_4_ * fVar182,
                            CONCAT48(auVar152._8_4_ * fVar181,
                                     CONCAT44(auVar152._4_4_ * fVar180,auVar152._0_4_ * fVar165))));
    auVar109 = vfmadd231ps_fma(auVar23,auVar89,ZEXT1632(auVar109));
    auVar87 = vshufps_avx(auVar75,auVar75,0xaa);
    uVar185 = auVar87._0_8_;
    auVar303._8_8_ = uVar185;
    auVar303._0_8_ = uVar185;
    auVar303._16_8_ = uVar185;
    auVar303._24_8_ = uVar185;
    auVar76 = vshufps_avx(auVar75,auVar75,0xff);
    uVar185 = auVar76._0_8_;
    auVar326._8_8_ = uVar185;
    auVar326._0_8_ = uVar185;
    auVar326._16_8_ = uVar185;
    auVar326._24_8_ = uVar185;
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar182 * auVar147._12_4_,
                                                 CONCAT48(fVar181 * auVar147._8_4_,
                                                          CONCAT44(fVar180 * auVar147._4_4_,
                                                                   fVar165 * auVar147._0_4_)))),
                              auVar89,ZEXT1632(auVar78));
    auVar74 = vshufps_avx(auVar240,auVar240,0xaa);
    auVar75 = vshufps_avx(auVar240,auVar240,0xff);
    local_5c8 = auVar75._0_4_;
    fStack_5c4 = auVar75._4_4_;
    auVar24._28_4_ = fStack_5c4;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(auVar166._12_4_ * fVar182,
                            CONCAT48(auVar166._8_4_ * fVar181,
                                     CONCAT44(auVar166._4_4_ * fVar180,auVar166._0_4_ * fVar165))));
    auVar75 = vfmadd231ps_fma(auVar24,auVar89,ZEXT1632(auVar152));
    auVar240 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar182 * auVar78._12_4_,
                                                  CONCAT48(fVar181 * auVar78._8_4_,
                                                           CONCAT44(fVar180 * auVar78._4_4_,
                                                                    fVar165 * auVar78._0_4_)))),
                               auVar89,ZEXT1632(auVar108));
    auVar18 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar108));
    auVar108 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar182 * auVar75._12_4_,
                                                  CONCAT48(fVar181 * auVar75._8_4_,
                                                           CONCAT44(fVar180 * auVar75._4_4_,
                                                                    fVar165 * auVar75._0_4_)))),
                               auVar89,ZEXT1632(auVar109));
    auVar19 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar109));
    fVar162 = fVar107 * auVar18._0_4_ * 3.0;
    fVar164 = fVar107 * auVar18._4_4_ * 3.0;
    auVar304._4_4_ = fVar164;
    auVar304._0_4_ = fVar162;
    fVar276 = fVar107 * auVar18._8_4_ * 3.0;
    auVar304._8_4_ = fVar276;
    fVar277 = fVar107 * auVar18._12_4_ * 3.0;
    auVar304._12_4_ = fVar277;
    fVar278 = fVar107 * auVar18._16_4_ * 3.0;
    auVar304._16_4_ = fVar278;
    fVar279 = fVar107 * auVar18._20_4_ * 3.0;
    auVar304._20_4_ = fVar279;
    fVar280 = fVar107 * auVar18._24_4_ * 3.0;
    auVar304._24_4_ = fVar280;
    auVar304._28_4_ = 0x40400000;
    local_5e8._0_4_ = fVar107 * auVar19._0_4_ * 3.0;
    local_5e8._4_4_ = fVar107 * auVar19._4_4_ * 3.0;
    fStack_5e0 = fVar107 * auVar19._8_4_ * 3.0;
    fStack_5dc = fVar107 * auVar19._12_4_ * 3.0;
    fStack_5d8 = fVar107 * auVar19._16_4_ * 3.0;
    fStack_5d4 = fVar107 * auVar19._20_4_ * 3.0;
    fStack_5d0 = fVar107 * auVar19._24_4_ * 3.0;
    fStack_5cc = auVar19._28_4_;
    fVar125 = auVar116._0_4_;
    fVar126 = auVar116._4_4_;
    auVar25._4_4_ = fVar126 * fVar180;
    auVar25._0_4_ = fVar125 * fVar165;
    auVar25._8_4_ = fVar125 * fVar181;
    auVar25._12_4_ = fVar126 * fVar182;
    auVar25._16_4_ = fVar125 * 0.0;
    auVar25._20_4_ = fVar126 * 0.0;
    auVar25._24_4_ = fVar125 * 0.0;
    auVar25._28_4_ = auVar18._28_4_;
    auVar116 = vfmadd231ps_fma(auVar25,auVar89,auVar205);
    fVar125 = auVar77._0_4_;
    fVar127 = auVar77._4_4_;
    auVar26._4_4_ = fVar127 * fVar180;
    auVar26._0_4_ = fVar125 * fVar165;
    auVar26._8_4_ = fVar125 * fVar181;
    auVar26._12_4_ = fVar127 * fVar182;
    auVar26._16_4_ = fVar125 * 0.0;
    auVar26._20_4_ = fVar127 * 0.0;
    auVar26._24_4_ = fVar125 * 0.0;
    auVar26._28_4_ = auVar12._4_4_;
    auVar12 = vfmadd231ps_fma(auVar26,auVar89,_local_658);
    fVar125 = auVar87._0_4_;
    fVar127 = auVar87._4_4_;
    auVar27._4_4_ = fVar127 * fVar180;
    auVar27._0_4_ = fVar125 * fVar165;
    auVar27._8_4_ = fVar125 * fVar181;
    auVar27._12_4_ = fVar127 * fVar182;
    auVar27._16_4_ = fVar125 * 0.0;
    auVar27._20_4_ = fVar127 * 0.0;
    auVar27._24_4_ = fVar125 * 0.0;
    auVar27._28_4_ = fVar107;
    auVar87 = vfmadd231ps_fma(auVar27,auVar89,auVar160);
    fVar125 = auVar76._0_4_;
    fVar183 = auVar76._4_4_;
    auVar28._4_4_ = fVar183 * fVar180;
    auVar28._0_4_ = fVar125 * fVar165;
    auVar28._8_4_ = fVar125 * fVar181;
    auVar28._12_4_ = fVar183 * fVar182;
    auVar28._16_4_ = fVar125 * 0.0;
    auVar28._20_4_ = fVar183 * 0.0;
    auVar28._24_4_ = fVar125 * 0.0;
    auVar28._28_4_ = fVar126;
    auVar76 = vfmadd231ps_fma(auVar28,auVar89,auVar179);
    local_408 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar240));
    fVar125 = auVar74._0_4_;
    fVar126 = auVar74._4_4_;
    auVar29._4_4_ = fVar126 * fVar180;
    auVar29._0_4_ = fVar125 * fVar165;
    auVar29._8_4_ = fVar125 * fVar181;
    auVar29._12_4_ = fVar126 * fVar182;
    auVar29._16_4_ = fVar125 * 0.0;
    auVar29._20_4_ = fVar126 * 0.0;
    auVar29._24_4_ = fVar125 * 0.0;
    auVar29._28_4_ = local_408._28_4_;
    auVar77 = vfmadd231ps_fma(auVar29,auVar89,auVar303);
    auVar22 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar108));
    auVar30._4_4_ = fVar180 * fStack_5c4;
    auVar30._0_4_ = fVar165 * local_5c8;
    auVar30._8_4_ = fVar181 * local_5c8;
    auVar30._12_4_ = fVar182 * fStack_5c4;
    auVar30._16_4_ = local_5c8 * 0.0;
    auVar30._20_4_ = fStack_5c4 * 0.0;
    auVar30._24_4_ = local_5c8 * 0.0;
    auVar30._28_4_ = fVar127;
    auVar74 = vfmadd231ps_fma(auVar30,auVar89,auVar326);
    auVar31._28_4_ = fVar126;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(fVar182 * auVar87._12_4_,
                            CONCAT48(fVar181 * auVar87._8_4_,
                                     CONCAT44(fVar180 * auVar87._4_4_,fVar165 * auVar87._0_4_))));
    auVar116 = vfmadd231ps_fma(auVar31,auVar89,ZEXT1632(auVar116));
    auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar182 * auVar76._12_4_,
                                                 CONCAT48(fVar181 * auVar76._8_4_,
                                                          CONCAT44(fVar180 * auVar76._4_4_,
                                                                   fVar165 * auVar76._0_4_)))),
                              auVar89,ZEXT1632(auVar12));
    fVar162 = auVar240._0_4_ + fVar162;
    fVar164 = auVar240._4_4_ + fVar164;
    fVar276 = auVar240._8_4_ + fVar276;
    fVar277 = auVar240._12_4_ + fVar277;
    fVar278 = fVar278 + 0.0;
    fVar279 = fVar279 + 0.0;
    fVar280 = fVar280 + 0.0;
    auVar32._28_4_ = 0x40400000;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(auVar74._12_4_ * fVar182,
                            CONCAT48(auVar74._8_4_ * fVar181,
                                     CONCAT44(auVar74._4_4_ * fVar180,auVar74._0_4_ * fVar165))));
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar182 * auVar77._12_4_,
                                                 CONCAT48(fVar181 * auVar77._8_4_,
                                                          CONCAT44(fVar180 * auVar77._4_4_,
                                                                   fVar165 * auVar77._0_4_)))),
                              auVar89,ZEXT1632(auVar87));
    auVar76 = vfmadd231ps_fma(auVar32,auVar89,ZEXT1632(auVar76));
    auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar182 * auVar87._12_4_,
                                                 CONCAT48(fVar181 * auVar87._8_4_,
                                                          CONCAT44(fVar180 * auVar87._4_4_,
                                                                   fVar165 * auVar87._0_4_)))),
                              auVar89,ZEXT1632(auVar116));
    auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar182 * auVar76._12_4_,
                                                 CONCAT48(fVar181 * auVar76._8_4_,
                                                          CONCAT44(fVar180 * auVar76._4_4_,
                                                                   fVar165 * auVar76._0_4_)))),
                              ZEXT1632(auVar12),auVar89);
    auVar89 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar116));
    auVar18 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar12));
    fVar165 = fVar107 * auVar89._0_4_ * 3.0;
    fVar180 = fVar107 * auVar89._4_4_ * 3.0;
    auVar33._4_4_ = fVar180;
    auVar33._0_4_ = fVar165;
    fVar181 = fVar107 * auVar89._8_4_ * 3.0;
    auVar33._8_4_ = fVar181;
    fVar182 = fVar107 * auVar89._12_4_ * 3.0;
    auVar33._12_4_ = fVar182;
    fVar183 = fVar107 * auVar89._16_4_ * 3.0;
    auVar33._16_4_ = fVar183;
    fVar184 = fVar107 * auVar89._20_4_ * 3.0;
    auVar33._20_4_ = fVar184;
    fVar146 = fVar107 * auVar89._24_4_ * 3.0;
    auVar33._24_4_ = fVar146;
    auVar33._28_4_ = 0x40400000;
    auVar229._0_4_ = fVar107 * auVar18._0_4_ * 3.0;
    auVar229._4_4_ = fVar107 * auVar18._4_4_ * 3.0;
    auVar229._8_4_ = fVar107 * auVar18._8_4_ * 3.0;
    auVar229._12_4_ = fVar107 * auVar18._12_4_ * 3.0;
    auVar229._16_4_ = fVar107 * auVar18._16_4_ * 3.0;
    auVar229._20_4_ = fVar107 * auVar18._20_4_ * 3.0;
    auVar229._24_4_ = fVar107 * auVar18._24_4_ * 3.0;
    auVar229._28_4_ = 0;
    auVar23 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar77));
    local_3a8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar74));
    auVar89 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar240));
    auVar18 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar108));
    auVar20 = vsubps_avx(auVar23,local_408);
    fVar163 = auVar89._0_4_ + auVar20._0_4_;
    fVar207 = auVar89._4_4_ + auVar20._4_4_;
    fVar208 = auVar89._8_4_ + auVar20._8_4_;
    fVar209 = auVar89._12_4_ + auVar20._12_4_;
    fVar210 = auVar89._16_4_ + auVar20._16_4_;
    fVar211 = auVar89._20_4_ + auVar20._20_4_;
    fVar212 = auVar89._24_4_ + auVar20._24_4_;
    auVar21 = vsubps_avx(local_3a8,auVar22);
    auVar316._0_4_ = auVar18._0_4_ + auVar21._0_4_;
    auVar316._4_4_ = auVar18._4_4_ + auVar21._4_4_;
    auVar316._8_4_ = auVar18._8_4_ + auVar21._8_4_;
    auVar316._12_4_ = auVar18._12_4_ + auVar21._12_4_;
    auVar316._16_4_ = auVar18._16_4_ + auVar21._16_4_;
    auVar316._20_4_ = auVar18._20_4_ + auVar21._20_4_;
    auVar316._24_4_ = auVar18._24_4_ + auVar21._24_4_;
    auVar316._28_4_ = auVar18._28_4_ + auVar21._28_4_;
    fVar107 = auVar108._0_4_;
    local_138 = fVar107 + (float)local_5e8._0_4_;
    fVar125 = auVar108._4_4_;
    fStack_134 = fVar125 + (float)local_5e8._4_4_;
    fVar126 = auVar108._8_4_;
    fStack_130 = fVar126 + fStack_5e0;
    fVar127 = auVar108._12_4_;
    fStack_12c = fVar127 + fStack_5dc;
    fStack_128 = fStack_5d8 + 0.0;
    fStack_124 = fStack_5d4 + 0.0;
    fStack_120 = fStack_5d0 + 0.0;
    fStack_11c = auVar19._28_4_ + 0.0;
    local_78 = ZEXT1632(auVar240);
    auVar18 = vsubps_avx(local_78,auVar304);
    local_b8 = vpermps_avx2(_DAT_0205d4a0,auVar18);
    local_98 = ZEXT1632(auVar108);
    auVar18 = vsubps_avx(local_98,_local_5e8);
    local_158 = vpermps_avx2(_DAT_0205d4a0,auVar18);
    local_d8._0_4_ = auVar77._0_4_ + fVar165;
    local_d8._4_4_ = auVar77._4_4_ + fVar180;
    local_d8._8_4_ = auVar77._8_4_ + fVar181;
    local_d8._12_4_ = auVar77._12_4_ + fVar182;
    local_d8._16_4_ = fVar183 + 0.0;
    local_d8._20_4_ = fVar184 + 0.0;
    local_d8._24_4_ = fVar146 + 0.0;
    local_d8._28_4_ = 0x40400000;
    auVar304 = ZEXT1632(auVar77);
    auVar18 = vsubps_avx(auVar304,auVar33);
    auVar24 = vpermps_avx2(_DAT_0205d4a0,auVar18);
    fVar165 = auVar74._0_4_;
    local_118._0_4_ = fVar165 + auVar229._0_4_;
    fVar180 = auVar74._4_4_;
    local_118._4_4_ = fVar180 + auVar229._4_4_;
    fVar181 = auVar74._8_4_;
    local_118._8_4_ = fVar181 + auVar229._8_4_;
    fVar182 = auVar74._12_4_;
    local_118._12_4_ = fVar182 + auVar229._12_4_;
    local_118._16_4_ = auVar229._16_4_ + 0.0;
    local_118._20_4_ = auVar229._20_4_ + 0.0;
    local_118._24_4_ = auVar229._24_4_ + 0.0;
    local_118._28_4_ = 0;
    auVar18 = vsubps_avx(ZEXT1632(auVar74),auVar229);
    local_f8 = vpermps_avx2(_DAT_0205d4a0,auVar18);
    auVar34._4_4_ = fVar125 * fVar207;
    auVar34._0_4_ = fVar107 * fVar163;
    auVar34._8_4_ = fVar126 * fVar208;
    auVar34._12_4_ = fVar127 * fVar209;
    auVar34._16_4_ = fVar210 * 0.0;
    auVar34._20_4_ = fVar211 * 0.0;
    auVar34._24_4_ = fVar212 * 0.0;
    auVar34._28_4_ = auVar18._28_4_;
    auVar12 = vfnmadd231ps_fma(auVar34,local_78,auVar316);
    auVar35._4_4_ = fStack_134 * fVar207;
    auVar35._0_4_ = local_138 * fVar163;
    auVar35._8_4_ = fStack_130 * fVar208;
    auVar35._12_4_ = fStack_12c * fVar209;
    auVar35._16_4_ = fStack_128 * fVar210;
    auVar35._20_4_ = fStack_124 * fVar211;
    auVar35._24_4_ = fStack_120 * fVar212;
    auVar35._28_4_ = auVar24._28_4_;
    auVar51._4_4_ = fVar164;
    auVar51._0_4_ = fVar162;
    auVar51._8_4_ = fVar276;
    auVar51._12_4_ = fVar277;
    auVar51._16_4_ = fVar278;
    auVar51._20_4_ = fVar279;
    auVar51._24_4_ = fVar280;
    auVar51._28_4_ = 0x40400000;
    auVar87 = vfnmadd231ps_fma(auVar35,auVar316,auVar51);
    auVar36._4_4_ = local_158._4_4_ * fVar207;
    auVar36._0_4_ = local_158._0_4_ * fVar163;
    auVar36._8_4_ = local_158._8_4_ * fVar208;
    auVar36._12_4_ = local_158._12_4_ * fVar209;
    auVar36._16_4_ = local_158._16_4_ * fVar210;
    auVar36._20_4_ = local_158._20_4_ * fVar211;
    auVar36._24_4_ = local_158._24_4_ * fVar212;
    auVar36._28_4_ = fStack_11c;
    auVar116 = vfnmadd231ps_fma(auVar36,local_b8,auVar316);
    local_658._0_4_ = auVar22._0_4_;
    local_658._4_4_ = auVar22._4_4_;
    uStack_650._0_4_ = auVar22._8_4_;
    uStack_650._4_4_ = auVar22._12_4_;
    uStack_648._0_4_ = auVar22._16_4_;
    uStack_648._4_4_ = auVar22._20_4_;
    uStack_640._0_4_ = auVar22._24_4_;
    auVar37._4_4_ = fVar207 * (float)local_658._4_4_;
    auVar37._0_4_ = fVar163 * (float)local_658._0_4_;
    auVar37._8_4_ = fVar208 * (float)uStack_650;
    auVar37._12_4_ = fVar209 * uStack_650._4_4_;
    auVar37._16_4_ = fVar210 * (float)uStack_648;
    auVar37._20_4_ = fVar211 * uStack_648._4_4_;
    auVar37._24_4_ = fVar212 * (float)uStack_640;
    auVar37._28_4_ = local_158._28_4_;
    auVar76 = vfnmadd231ps_fma(auVar37,local_408,auVar316);
    auVar57._4_4_ = fVar180 * fVar207;
    auVar57._0_4_ = fVar165 * fVar163;
    auVar57._8_4_ = fVar181 * fVar208;
    auVar57._12_4_ = fVar182 * fVar209;
    auVar57._16_4_ = fVar210 * 0.0;
    auVar57._20_4_ = fVar211 * 0.0;
    auVar57._24_4_ = fVar212 * 0.0;
    auVar57._28_4_ = DAT_0205d4a0._28_4_;
    auVar77 = vfnmadd231ps_fma(auVar57,auVar304,auVar316);
    auVar38._4_4_ = local_118._4_4_ * fVar207;
    auVar38._0_4_ = local_118._0_4_ * fVar163;
    auVar38._8_4_ = local_118._8_4_ * fVar208;
    auVar38._12_4_ = local_118._12_4_ * fVar209;
    auVar38._16_4_ = local_118._16_4_ * fVar210;
    auVar38._20_4_ = local_118._20_4_ * fVar211;
    auVar38._24_4_ = local_118._24_4_ * fVar212;
    auVar38._28_4_ = local_408._28_4_;
    auVar75 = vfnmadd231ps_fma(auVar38,local_d8,auVar316);
    auVar39._4_4_ = local_f8._4_4_ * fVar207;
    auVar39._0_4_ = local_f8._0_4_ * fVar163;
    auVar39._8_4_ = local_f8._8_4_ * fVar208;
    auVar39._12_4_ = local_f8._12_4_ * fVar209;
    auVar39._16_4_ = local_f8._16_4_ * fVar210;
    auVar39._20_4_ = local_f8._20_4_ * fVar211;
    auVar39._24_4_ = local_f8._24_4_ * fVar212;
    auVar39._28_4_ = local_b8._28_4_;
    auVar240 = vfnmadd231ps_fma(auVar39,auVar316,auVar24);
    auVar40._4_4_ = local_3a8._4_4_ * fVar207;
    auVar40._0_4_ = local_3a8._0_4_ * fVar163;
    auVar40._8_4_ = local_3a8._8_4_ * fVar208;
    auVar40._12_4_ = local_3a8._12_4_ * fVar209;
    auVar40._16_4_ = local_3a8._16_4_ * fVar210;
    auVar40._20_4_ = local_3a8._20_4_ * fVar211;
    auVar40._24_4_ = local_3a8._24_4_ * fVar212;
    auVar40._28_4_ = auVar89._28_4_ + auVar20._28_4_;
    auVar108 = vfnmadd231ps_fma(auVar40,auVar316,auVar23);
    auVar18 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar87));
    auVar89 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar87));
    auVar19 = vminps_avx(ZEXT1632(auVar116),ZEXT1632(auVar76));
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(ZEXT1632(auVar116),ZEXT1632(auVar76));
    auVar89 = vmaxps_avx(auVar89,auVar18);
    auVar20 = vminps_avx(ZEXT1632(auVar77),ZEXT1632(auVar75));
    auVar18 = vmaxps_avx(ZEXT1632(auVar77),ZEXT1632(auVar75));
    auVar21 = vminps_avx(ZEXT1632(auVar240),ZEXT1632(auVar108));
    auVar20 = vminps_avx(auVar20,auVar21);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(ZEXT1632(auVar240),ZEXT1632(auVar108));
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar89,auVar18);
    auVar56._4_4_ = fStack_174;
    auVar56._0_4_ = local_178;
    auVar56._8_4_ = fStack_170;
    auVar56._12_4_ = fStack_16c;
    auVar56._16_4_ = fStack_168;
    auVar56._20_4_ = fStack_164;
    auVar56._24_4_ = fStack_160;
    auVar56._28_4_ = fStack_15c;
    auVar89 = vcmpps_avx(auVar20,auVar56,2);
    auVar55._4_4_ = fStack_194;
    auVar55._0_4_ = local_198;
    auVar55._8_4_ = fStack_190;
    auVar55._12_4_ = fStack_18c;
    auVar55._16_4_ = fStack_188;
    auVar55._20_4_ = fStack_184;
    auVar55._24_4_ = fStack_180;
    auVar55._28_4_ = fStack_17c;
    auVar18 = vcmpps_avx(auVar18,auVar55,5);
    auVar89 = vandps_avx(auVar18,auVar89);
    auVar18 = local_268 & auVar89;
    uVar59 = 0;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar18 = vsubps_avx(local_408,local_78);
      auVar19 = vsubps_avx(auVar23,auVar304);
      fVar184 = auVar18._0_4_ + auVar19._0_4_;
      fVar146 = auVar18._4_4_ + auVar19._4_4_;
      fVar163 = auVar18._8_4_ + auVar19._8_4_;
      fVar207 = auVar18._12_4_ + auVar19._12_4_;
      fVar208 = auVar18._16_4_ + auVar19._16_4_;
      fVar209 = auVar18._20_4_ + auVar19._20_4_;
      fVar210 = auVar18._24_4_ + auVar19._24_4_;
      auVar20 = vsubps_avx(auVar22,local_98);
      auVar21 = vsubps_avx(local_3a8,ZEXT1632(auVar74));
      auVar106._0_4_ = auVar20._0_4_ + auVar21._0_4_;
      auVar106._4_4_ = auVar20._4_4_ + auVar21._4_4_;
      auVar106._8_4_ = auVar20._8_4_ + auVar21._8_4_;
      auVar106._12_4_ = auVar20._12_4_ + auVar21._12_4_;
      auVar106._16_4_ = auVar20._16_4_ + auVar21._16_4_;
      auVar106._20_4_ = auVar20._20_4_ + auVar21._20_4_;
      auVar106._24_4_ = auVar20._24_4_ + auVar21._24_4_;
      fVar183 = auVar21._28_4_;
      auVar106._28_4_ = auVar20._28_4_ + fVar183;
      auVar327._0_4_ = fVar107 * fVar184;
      auVar327._4_4_ = fVar125 * fVar146;
      auVar327._8_4_ = fVar126 * fVar163;
      auVar327._12_4_ = fVar127 * fVar207;
      auVar327._16_4_ = fVar208 * 0.0;
      auVar327._20_4_ = fVar209 * 0.0;
      auVar327._24_4_ = fVar210 * 0.0;
      auVar327._28_4_ = 0;
      auVar77 = vfnmadd231ps_fma(auVar327,auVar106,local_78);
      auVar41._4_4_ = fVar146 * fStack_134;
      auVar41._0_4_ = fVar184 * local_138;
      auVar41._8_4_ = fVar163 * fStack_130;
      auVar41._12_4_ = fVar207 * fStack_12c;
      auVar41._16_4_ = fVar208 * fStack_128;
      auVar41._20_4_ = fVar209 * fStack_124;
      auVar41._24_4_ = fVar210 * fStack_120;
      auVar41._28_4_ = fVar183;
      auVar52._4_4_ = fVar164;
      auVar52._0_4_ = fVar162;
      auVar52._8_4_ = fVar276;
      auVar52._12_4_ = fVar277;
      auVar52._16_4_ = fVar278;
      auVar52._20_4_ = fVar279;
      auVar52._24_4_ = fVar280;
      auVar52._28_4_ = 0x40400000;
      auVar12 = vfnmadd213ps_fma(auVar52,auVar106,auVar41);
      auVar42._4_4_ = fVar146 * local_158._4_4_;
      auVar42._0_4_ = fVar184 * local_158._0_4_;
      auVar42._8_4_ = fVar163 * local_158._8_4_;
      auVar42._12_4_ = fVar207 * local_158._12_4_;
      auVar42._16_4_ = fVar208 * local_158._16_4_;
      auVar42._20_4_ = fVar209 * local_158._20_4_;
      auVar42._24_4_ = fVar210 * local_158._24_4_;
      auVar42._28_4_ = fVar183;
      auVar87 = vfnmadd213ps_fma(local_b8,auVar106,auVar42);
      auVar43._4_4_ = (float)local_658._4_4_ * fVar146;
      auVar43._0_4_ = (float)local_658._0_4_ * fVar184;
      auVar43._8_4_ = (float)uStack_650 * fVar163;
      auVar43._12_4_ = uStack_650._4_4_ * fVar207;
      auVar43._16_4_ = (float)uStack_648 * fVar208;
      auVar43._20_4_ = uStack_648._4_4_ * fVar209;
      auVar43._24_4_ = (float)uStack_640 * fVar210;
      auVar43._28_4_ = fVar183;
      auVar74 = vfnmadd231ps_fma(auVar43,auVar106,local_408);
      auVar123._0_4_ = fVar165 * fVar184;
      auVar123._4_4_ = fVar180 * fVar146;
      auVar123._8_4_ = fVar181 * fVar163;
      auVar123._12_4_ = fVar182 * fVar207;
      auVar123._16_4_ = fVar208 * 0.0;
      auVar123._20_4_ = fVar209 * 0.0;
      auVar123._24_4_ = fVar210 * 0.0;
      auVar123._28_4_ = 0;
      auVar75 = vfnmadd231ps_fma(auVar123,auVar106,auVar304);
      auVar44._4_4_ = fVar146 * local_118._4_4_;
      auVar44._0_4_ = fVar184 * local_118._0_4_;
      auVar44._8_4_ = fVar163 * local_118._8_4_;
      auVar44._12_4_ = fVar207 * local_118._12_4_;
      auVar44._16_4_ = fVar208 * local_118._16_4_;
      auVar44._20_4_ = fVar209 * local_118._20_4_;
      auVar44._24_4_ = fVar210 * local_118._24_4_;
      auVar44._28_4_ = auVar22._28_4_;
      auVar116 = vfnmadd213ps_fma(local_d8,auVar106,auVar44);
      auVar45._4_4_ = fVar146 * local_f8._4_4_;
      auVar45._0_4_ = fVar184 * local_f8._0_4_;
      auVar45._8_4_ = fVar163 * local_f8._8_4_;
      auVar45._12_4_ = fVar207 * local_f8._12_4_;
      auVar45._16_4_ = fVar208 * local_f8._16_4_;
      auVar45._20_4_ = fVar209 * local_f8._20_4_;
      auVar45._24_4_ = fVar210 * local_f8._24_4_;
      auVar45._28_4_ = auVar22._28_4_;
      auVar76 = vfnmadd213ps_fma(auVar24,auVar106,auVar45);
      auVar46._4_4_ = local_3a8._4_4_ * fVar146;
      auVar46._0_4_ = local_3a8._0_4_ * fVar184;
      auVar46._8_4_ = local_3a8._8_4_ * fVar163;
      auVar46._12_4_ = local_3a8._12_4_ * fVar207;
      auVar46._16_4_ = local_3a8._16_4_ * fVar208;
      auVar46._20_4_ = local_3a8._20_4_ * fVar209;
      auVar46._24_4_ = local_3a8._24_4_ * fVar210;
      auVar46._28_4_ = auVar18._28_4_ + auVar19._28_4_;
      auVar240 = vfnmadd231ps_fma(auVar46,auVar106,auVar23);
      auVar19 = vminps_avx(ZEXT1632(auVar77),ZEXT1632(auVar12));
      auVar18 = vmaxps_avx(ZEXT1632(auVar77),ZEXT1632(auVar12));
      auVar20 = vminps_avx(ZEXT1632(auVar87),ZEXT1632(auVar74));
      auVar20 = vminps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(ZEXT1632(auVar87),ZEXT1632(auVar74));
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar21 = vminps_avx(ZEXT1632(auVar75),ZEXT1632(auVar116));
      auVar19 = vmaxps_avx(ZEXT1632(auVar75),ZEXT1632(auVar116));
      auVar22 = vminps_avx(ZEXT1632(auVar76),ZEXT1632(auVar240));
      auVar21 = vminps_avx(auVar21,auVar22);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(ZEXT1632(auVar76),ZEXT1632(auVar240));
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vcmpps_avx(auVar21,auVar56,2);
      auVar19 = vcmpps_avx(auVar19,auVar55,5);
      auVar18 = vandps_avx(auVar19,auVar18);
      auVar89 = vandps_avx(auVar89,local_268);
      auVar19 = auVar89 & auVar18;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar89 = vandps_avx(auVar18,auVar89);
        uVar59 = vmovmskps_avx(auVar89);
      }
    }
    if (uVar59 != 0) {
      auStack_3e8[uVar63] = uVar59;
      uVar185 = vmovlps_avx(local_318);
      *(undefined8 *)(&uStack_248 + uVar63 * 2) = uVar185;
      uVar68 = vmovlps_avx(local_668);
      auStack_58[uVar63] = uVar68;
      uVar63 = (ulong)((int)uVar63 + 1);
    }
    do {
      if ((int)uVar63 == 0) {
        if ((uVar69 & 1) != 0) {
          return local_669;
        }
        uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar88._4_4_ = uVar73;
        auVar88._0_4_ = uVar73;
        auVar88._8_4_ = uVar73;
        auVar88._12_4_ = uVar73;
        auVar12 = vcmpps_avx(local_328,auVar88,2);
        uVar62 = vmovmskps_avx(auVar12);
        uVar58 = uVar58 & uVar58 + 0xf & uVar62;
        local_669 = uVar58 != 0;
        if (!local_669) {
          return local_669;
        }
        goto LAB_01761a73;
      }
      uVar60 = (int)uVar63 - 1;
      uVar64 = (ulong)uVar60;
      uVar67 = auStack_3e8[uVar64];
      uVar59 = (&uStack_248)[uVar64 * 2];
      fVar165 = afStack_244[uVar64 * 2];
      iVar61 = 0;
      for (uVar68 = (ulong)uVar67; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
        iVar61 = iVar61 + 1;
      }
      uVar67 = uVar67 - 1 & uVar67;
      if (uVar67 == 0) {
        uVar63 = (ulong)uVar60;
      }
      local_668._8_8_ = 0;
      local_668._0_8_ = auStack_58[uVar64];
      auStack_3e8[uVar64] = uVar67;
      fVar180 = (float)(iVar61 + 1) * 0.14285715;
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * (float)iVar61 * 0.14285715)),
                                ZEXT416(uVar59),ZEXT416((uint)(1.0 - (float)iVar61 * 0.14285715)));
      auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar180)),ZEXT416(uVar59),
                                ZEXT416((uint)(1.0 - fVar180)));
      auVar206._0_4_ = auVar12._0_4_;
      fVar180 = auVar87._0_4_;
      fVar165 = fVar180 - auVar206._0_4_;
      if (0.16666667 <= fVar165) break;
      auVar116 = vshufps_avx(local_668,local_668,0x50);
      auVar112._8_4_ = 0x3f800000;
      auVar112._0_8_ = &DAT_3f8000003f800000;
      auVar112._12_4_ = 0x3f800000;
      auVar76 = vsubps_avx(auVar112,auVar116);
      fVar181 = auVar116._0_4_;
      auVar136._0_4_ = fVar181 * fVar128;
      fVar182 = auVar116._4_4_;
      auVar136._4_4_ = fVar182 * fVar145;
      fVar107 = auVar116._8_4_;
      auVar136._8_4_ = fVar107 * fVar128;
      fVar125 = auVar116._12_4_;
      auVar136._12_4_ = fVar125 * fVar145;
      auVar150._0_4_ = fVar181 * fVar213;
      auVar150._4_4_ = fVar182 * fVar230;
      auVar150._8_4_ = fVar107 * fVar213;
      auVar150._12_4_ = fVar125 * fVar230;
      auVar173._0_4_ = fVar181 * fVar251;
      auVar173._4_4_ = fVar182 * fVar263;
      auVar173._8_4_ = fVar107 * fVar251;
      auVar173._12_4_ = fVar125 * fVar263;
      auVar98._0_4_ = fVar181 * fVar317;
      auVar98._4_4_ = fVar182 * fVar328;
      auVar98._8_4_ = fVar107 * fVar317;
      auVar98._12_4_ = fVar125 * fVar328;
      auVar116 = vfmadd231ps_fma(auVar136,auVar76,auVar200);
      auVar77 = vfmadd231ps_fma(auVar150,auVar76,auVar237);
      auVar74 = vfmadd231ps_fma(auVar173,auVar76,auVar269);
      auVar76 = vfmadd231ps_fma(auVar98,auVar76,auVar308);
      auVar124._16_16_ = auVar116;
      auVar124._0_16_ = auVar116;
      auVar143._16_16_ = auVar77;
      auVar143._0_16_ = auVar77;
      auVar161._16_16_ = auVar74;
      auVar161._0_16_ = auVar74;
      auVar206._4_4_ = auVar206._0_4_;
      auVar206._8_4_ = auVar206._0_4_;
      auVar206._12_4_ = auVar206._0_4_;
      auVar206._20_4_ = fVar180;
      auVar206._16_4_ = fVar180;
      auVar206._24_4_ = fVar180;
      auVar206._28_4_ = fVar180;
      auVar89 = vsubps_avx(auVar143,auVar124);
      auVar77 = vfmadd213ps_fma(auVar89,auVar206,auVar124);
      auVar89 = vsubps_avx(auVar161,auVar143);
      auVar75 = vfmadd213ps_fma(auVar89,auVar206,auVar143);
      auVar116 = vsubps_avx(auVar76,auVar74);
      auVar144._16_16_ = auVar116;
      auVar144._0_16_ = auVar116;
      auVar116 = vfmadd213ps_fma(auVar144,auVar206,auVar161);
      auVar89 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar77));
      auVar76 = vfmadd213ps_fma(auVar89,auVar206,ZEXT1632(auVar77));
      auVar89 = vsubps_avx(ZEXT1632(auVar116),ZEXT1632(auVar75));
      auVar116 = vfmadd213ps_fma(auVar89,auVar206,ZEXT1632(auVar75));
      auVar89 = vsubps_avx(ZEXT1632(auVar116),ZEXT1632(auVar76));
      auVar109 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar89,auVar206);
      fVar127 = auVar89._4_4_ * 3.0;
      fVar126 = fVar165 * 0.33333334;
      auVar270._0_8_ =
           CONCAT44(auVar109._4_4_ + fVar126 * fVar127,
                    auVar109._0_4_ + fVar126 * auVar89._0_4_ * 3.0);
      auVar270._8_4_ = auVar109._8_4_ + fVar126 * auVar89._8_4_ * 3.0;
      auVar270._12_4_ = auVar109._12_4_ + fVar126 * auVar89._12_4_ * 3.0;
      auVar76 = vshufpd_avx(auVar109,auVar109,3);
      auVar77 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar116 = vsubps_avx(auVar76,auVar109);
      auVar74 = vsubps_avx(auVar77,(undefined1  [16])0x0);
      auVar113._0_4_ = auVar116._0_4_ + auVar74._0_4_;
      auVar113._4_4_ = auVar116._4_4_ + auVar74._4_4_;
      auVar113._8_4_ = auVar116._8_4_ + auVar74._8_4_;
      auVar113._12_4_ = auVar116._12_4_ + auVar74._12_4_;
      auVar116 = vshufps_avx(auVar109,auVar109,0xb1);
      auVar74 = vshufps_avx(auVar270,auVar270,0xb1);
      auVar309._4_4_ = auVar113._0_4_;
      auVar309._0_4_ = auVar113._0_4_;
      auVar309._8_4_ = auVar113._0_4_;
      auVar309._12_4_ = auVar113._0_4_;
      auVar75 = vshufps_avx(auVar113,auVar113,0x55);
      fVar181 = auVar75._0_4_;
      auVar222._0_4_ = auVar116._0_4_ * fVar181;
      fVar182 = auVar75._4_4_;
      auVar222._4_4_ = auVar116._4_4_ * fVar182;
      fVar107 = auVar75._8_4_;
      auVar222._8_4_ = auVar116._8_4_ * fVar107;
      fVar125 = auVar75._12_4_;
      auVar222._12_4_ = auVar116._12_4_ * fVar125;
      auVar238._0_4_ = auVar74._0_4_ * fVar181;
      auVar238._4_4_ = auVar74._4_4_ * fVar182;
      auVar238._8_4_ = auVar74._8_4_ * fVar107;
      auVar238._12_4_ = auVar74._12_4_ * fVar125;
      auVar240 = vfmadd231ps_fma(auVar222,auVar309,auVar109);
      local_408._0_16_ = auVar270;
      auVar108 = vfmadd231ps_fma(auVar238,auVar309,auVar270);
      auVar74 = vshufps_avx(auVar240,auVar240,0xe8);
      auVar75 = vshufps_avx(auVar108,auVar108,0xe8);
      auVar116 = vcmpps_avx(auVar74,auVar75,1);
      uVar59 = vextractps_avx(auVar116,0);
      auVar78 = auVar108;
      if ((uVar59 & 1) == 0) {
        auVar78 = auVar240;
      }
      auVar151._0_4_ = fVar126 * auVar89._16_4_ * 3.0;
      auVar151._4_4_ = fVar126 * fVar127;
      auVar151._8_4_ = fVar126 * auVar89._24_4_ * 3.0;
      auVar151._12_4_ = fVar126 * fVar180;
      auVar186 = vsubps_avx((undefined1  [16])0x0,auVar151);
      auVar152 = vshufps_avx(auVar186,auVar186,0xb1);
      auVar147 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar332._0_4_ = auVar152._0_4_ * fVar181;
      auVar332._4_4_ = auVar152._4_4_ * fVar182;
      auVar332._8_4_ = auVar152._8_4_ * fVar107;
      auVar332._12_4_ = auVar152._12_4_ * fVar125;
      auVar114._0_4_ = auVar147._0_4_ * fVar181;
      auVar114._4_4_ = auVar147._4_4_ * fVar182;
      auVar114._8_4_ = auVar147._8_4_ * fVar107;
      auVar114._12_4_ = auVar147._12_4_ * fVar125;
      auVar187 = vfmadd231ps_fma(auVar332,auVar309,auVar186);
      auVar188 = vfmadd231ps_fma(auVar114,(undefined1  [16])0x0,auVar309);
      auVar147 = vshufps_avx(auVar187,auVar187,0xe8);
      auVar166 = vshufps_avx(auVar188,auVar188,0xe8);
      auVar152 = vcmpps_avx(auVar147,auVar166,1);
      uVar59 = vextractps_avx(auVar152,0);
      auVar214 = auVar188;
      if ((uVar59 & 1) == 0) {
        auVar214 = auVar187;
      }
      auVar78 = vmaxss_avx(auVar214,auVar78);
      auVar74 = vminps_avx(auVar74,auVar75);
      auVar75 = vminps_avx(auVar147,auVar166);
      auVar75 = vminps_avx(auVar74,auVar75);
      auVar116 = vshufps_avx(auVar116,auVar116,0x55);
      auVar116 = vblendps_avx(auVar116,auVar152,2);
      auVar152 = vpslld_avx(auVar116,0x1f);
      auVar116 = vshufpd_avx(auVar108,auVar108,1);
      auVar116 = vinsertps_avx(auVar116,auVar188,0x9c);
      auVar74 = vshufpd_avx(auVar240,auVar240,1);
      auVar74 = vinsertps_avx(auVar74,auVar187,0x9c);
      auVar116 = vblendvps_avx(auVar74,auVar116,auVar152);
      auVar74 = vmovshdup_avx(auVar116);
      auVar116 = vmaxss_avx(auVar74,auVar116);
      fVar107 = auVar75._0_4_;
      auVar74 = vmovshdup_avx(auVar75);
      fVar182 = auVar116._0_4_;
      fVar181 = auVar78._0_4_;
      if ((0.0001 <= fVar107) || (fVar182 <= -0.0001)) {
        auVar240 = vcmpps_avx(auVar74,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar108 = vcmpps_avx(auVar75,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar240 = vorps_avx(auVar108,auVar240);
        if ((-0.0001 < fVar181 & auVar240[0]) != 0) goto LAB_01762f77;
        auVar240 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar116,5);
        auVar108 = vcmpps_avx(auVar74,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar240 = vorps_avx(auVar108,auVar240);
        if ((auVar240 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_01762f77;
LAB_01763aa7:
        bVar47 = true;
      }
      else {
LAB_01762f77:
        auVar108 = vcmpps_avx(auVar75,_DAT_01feba10,1);
        auVar152 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar240 = vcmpss_avx(auVar78,ZEXT816(0) << 0x20,1);
        auVar174._8_4_ = 0x3f800000;
        auVar174._0_8_ = &DAT_3f8000003f800000;
        auVar174._12_4_ = 0x3f800000;
        auVar239._8_4_ = 0xbf800000;
        auVar239._0_8_ = 0xbf800000bf800000;
        auVar239._12_4_ = 0xbf800000;
        auVar240 = vblendvps_avx(auVar174,auVar239,auVar240);
        auVar108 = vblendvps_avx(auVar174,auVar239,auVar108);
        fVar125 = auVar108._0_4_;
        fVar126 = auVar240._0_4_;
        auVar240 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar125 == fVar126) && (!NAN(fVar125) && !NAN(fVar126))) {
          auVar240 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar125 == fVar126) && (!NAN(fVar125) && !NAN(fVar126))) {
          auVar152 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar108 = vmovshdup_avx(auVar108);
        fVar127 = auVar108._0_4_;
        auVar108 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar125 != fVar127) || (NAN(fVar125) || NAN(fVar127))) {
          fVar125 = auVar74._0_4_;
          if ((fVar125 != fVar107) || (NAN(fVar125) || NAN(fVar107))) {
            auVar115._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
            auVar115._8_4_ = auVar75._8_4_ ^ 0x80000000;
            auVar115._12_4_ = auVar75._12_4_ ^ 0x80000000;
            auVar153._0_4_ = -fVar107 / (fVar125 - fVar107);
            auVar153._4_12_ = auVar115._4_12_;
            auVar50._12_4_ = 0;
            auVar50._0_12_ = ZEXT812(0);
            auVar175._12_4_ = 0;
            auVar175._0_12_ = ZEXT812(0);
            auVar175 = auVar175 << 0x20;
            auVar74 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar153._0_4_)),auVar50 << 0x20,auVar153
                                     );
            auVar75 = auVar74;
          }
          else {
            auVar74 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar107 == 0.0) && (auVar74 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar107))) {
              auVar74 = ZEXT816(0);
            }
            auVar175 = ZEXT816(0) << 0x20;
            auVar75 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar107 == 0.0) && (auVar75 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar107))) {
              auVar75 = auVar108;
            }
          }
          auVar240 = vminss_avx(auVar240,auVar74);
          auVar152 = vmaxss_avx(auVar75,auVar152);
        }
        else {
          auVar175 = ZEXT816(0) << 0x20;
        }
        auVar116 = vcmpss_avx(auVar116,auVar175,1);
        auVar154._8_4_ = 0x3f800000;
        auVar154._0_8_ = &DAT_3f8000003f800000;
        auVar154._12_4_ = 0x3f800000;
        auVar296._8_4_ = 0xbf800000;
        auVar296._0_8_ = 0xbf800000bf800000;
        auVar296._12_4_ = 0xbf800000;
        auVar116 = vblendvps_avx(auVar154,auVar296,auVar116);
        fVar107 = auVar116._0_4_;
        if ((fVar126 != fVar107) || (NAN(fVar126) || NAN(fVar107))) {
          if ((fVar182 != fVar181) || (NAN(fVar182) || NAN(fVar181))) {
            auVar117._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
            auVar117._8_4_ = auVar78._8_4_ ^ 0x80000000;
            auVar117._12_4_ = auVar78._12_4_ ^ 0x80000000;
            auVar155._0_4_ = -fVar181 / (fVar182 - fVar181);
            auVar155._4_12_ = auVar117._4_12_;
            auVar116 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar155._0_4_)),auVar175,auVar155);
            auVar74 = auVar116;
          }
          else {
            auVar116 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar181 == 0.0) && (auVar116 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar181))) {
              auVar116 = ZEXT816(0);
            }
            auVar74 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar181 == 0.0) && (auVar74 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar181))) {
              auVar74 = auVar108;
            }
          }
          auVar240 = vminss_avx(auVar240,auVar116);
          auVar152 = vmaxss_avx(auVar74,auVar152);
        }
        if ((fVar127 != fVar107) || (NAN(fVar127) || NAN(fVar107))) {
          auVar240 = vminss_avx(auVar240,auVar108);
          auVar152 = vmaxss_avx(auVar108,auVar152);
        }
        auVar116 = vmaxss_avx(auVar175,auVar240);
        auVar74 = vminss_avx(auVar152,auVar108);
        bVar47 = true;
        if (auVar116._0_4_ <= auVar74._0_4_) {
          auVar116 = vmaxss_avx(auVar175,ZEXT416((uint)(auVar116._0_4_ + -0.1)));
          auVar74 = vminss_avx(ZEXT416((uint)(auVar74._0_4_ + 0.1)),auVar108);
          auVar99._0_8_ = auVar109._0_8_;
          auVar99._8_8_ = auVar99._0_8_;
          auVar241._8_8_ = auVar270._0_8_;
          auVar241._0_8_ = auVar270._0_8_;
          auVar258._8_8_ = auVar186._0_8_;
          auVar258._0_8_ = auVar186._0_8_;
          auVar75 = vshufpd_avx(auVar270,auVar270,3);
          auVar240 = vshufpd_avx(auVar186,auVar186,3);
          auVar108 = vshufps_avx(auVar116,auVar74,0);
          auVar137._8_4_ = 0x3f800000;
          auVar137._0_8_ = &DAT_3f8000003f800000;
          auVar137._12_4_ = 0x3f800000;
          auVar109 = vsubps_avx(auVar137,auVar108);
          local_5e8._0_4_ = auVar76._0_4_;
          local_5e8._4_4_ = auVar76._4_4_;
          fStack_5e0 = auVar76._8_4_;
          fStack_5dc = auVar76._12_4_;
          fVar181 = auVar108._0_4_;
          auVar138._0_4_ = fVar181 * (float)local_5e8._0_4_;
          fVar182 = auVar108._4_4_;
          auVar138._4_4_ = fVar182 * (float)local_5e8._4_4_;
          fVar107 = auVar108._8_4_;
          auVar138._8_4_ = fVar107 * fStack_5e0;
          fVar125 = auVar108._12_4_;
          auVar138._12_4_ = fVar125 * fStack_5dc;
          auVar156._0_4_ = auVar75._0_4_ * fVar181;
          auVar156._4_4_ = auVar75._4_4_ * fVar182;
          auVar156._8_4_ = auVar75._8_4_ * fVar107;
          auVar156._12_4_ = auVar75._12_4_ * fVar125;
          auVar176._0_4_ = auVar240._0_4_ * fVar181;
          auVar176._4_4_ = auVar240._4_4_ * fVar182;
          auVar176._8_4_ = auVar240._8_4_ * fVar107;
          auVar176._12_4_ = auVar240._12_4_ * fVar125;
          local_658._0_4_ = auVar77._0_4_;
          local_658._4_4_ = auVar77._4_4_;
          uStack_650._0_4_ = auVar77._8_4_;
          uStack_650._4_4_ = auVar77._12_4_;
          auVar201._0_4_ = fVar181 * (float)local_658._0_4_;
          auVar201._4_4_ = fVar182 * (float)local_658._4_4_;
          auVar201._8_4_ = fVar107 * (float)uStack_650;
          auVar201._12_4_ = fVar125 * uStack_650._4_4_;
          auVar75 = vfmadd231ps_fma(auVar138,auVar109,auVar99);
          auVar240 = vfmadd231ps_fma(auVar156,auVar109,auVar241);
          auVar108 = vfmadd231ps_fma(auVar176,auVar109,auVar258);
          auVar109 = vfmadd231ps_fma(auVar201,auVar109,ZEXT816(0));
          auVar76 = vmovshdup_avx(local_668);
          auVar147 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar116._0_4_)),local_668,
                                     ZEXT416((uint)(1.0 - auVar116._0_4_)));
          auVar166 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar74._0_4_)),local_668,
                                     ZEXT416((uint)(1.0 - auVar74._0_4_)));
          fVar181 = 1.0 / fVar165;
          auVar116 = vsubps_avx(auVar240,auVar75);
          auVar223._0_4_ = auVar116._0_4_ * 3.0;
          auVar223._4_4_ = auVar116._4_4_ * 3.0;
          auVar223._8_4_ = auVar116._8_4_ * 3.0;
          auVar223._12_4_ = auVar116._12_4_ * 3.0;
          auVar116 = vsubps_avx(auVar108,auVar240);
          auVar242._0_4_ = auVar116._0_4_ * 3.0;
          auVar242._4_4_ = auVar116._4_4_ * 3.0;
          auVar242._8_4_ = auVar116._8_4_ * 3.0;
          auVar242._12_4_ = auVar116._12_4_ * 3.0;
          auVar116 = vsubps_avx(auVar109,auVar108);
          auVar259._0_4_ = auVar116._0_4_ * 3.0;
          auVar259._4_4_ = auVar116._4_4_ * 3.0;
          auVar259._8_4_ = auVar116._8_4_ * 3.0;
          auVar259._12_4_ = auVar116._12_4_ * 3.0;
          auVar76 = vminps_avx(auVar242,auVar259);
          auVar116 = vmaxps_avx(auVar242,auVar259);
          auVar76 = vminps_avx(auVar223,auVar76);
          auVar116 = vmaxps_avx(auVar223,auVar116);
          auVar77 = vshufpd_avx(auVar76,auVar76,3);
          auVar74 = vshufpd_avx(auVar116,auVar116,3);
          auVar76 = vminps_avx(auVar76,auVar77);
          auVar116 = vmaxps_avx(auVar116,auVar74);
          auVar243._0_4_ = auVar76._0_4_ * fVar181;
          auVar243._4_4_ = auVar76._4_4_ * fVar181;
          auVar243._8_4_ = auVar76._8_4_ * fVar181;
          auVar243._12_4_ = auVar76._12_4_ * fVar181;
          auVar224._0_4_ = fVar181 * auVar116._0_4_;
          auVar224._4_4_ = fVar181 * auVar116._4_4_;
          auVar224._8_4_ = fVar181 * auVar116._8_4_;
          auVar224._12_4_ = fVar181 * auVar116._12_4_;
          fVar181 = 1.0 / (auVar166._0_4_ - auVar147._0_4_);
          auVar116 = vshufpd_avx(auVar75,auVar75,3);
          auVar76 = vshufpd_avx(auVar240,auVar240,3);
          auVar77 = vshufpd_avx(auVar108,auVar108,3);
          auVar74 = vshufpd_avx(auVar109,auVar109,3);
          auVar116 = vsubps_avx(auVar116,auVar75);
          auVar75 = vsubps_avx(auVar76,auVar240);
          auVar240 = vsubps_avx(auVar77,auVar108);
          auVar74 = vsubps_avx(auVar74,auVar109);
          auVar76 = vminps_avx(auVar116,auVar75);
          auVar116 = vmaxps_avx(auVar116,auVar75);
          auVar77 = vminps_avx(auVar240,auVar74);
          auVar77 = vminps_avx(auVar76,auVar77);
          auVar76 = vmaxps_avx(auVar240,auVar74);
          auVar116 = vmaxps_avx(auVar116,auVar76);
          auVar286._0_4_ = fVar181 * auVar77._0_4_;
          auVar286._4_4_ = fVar181 * auVar77._4_4_;
          auVar286._8_4_ = fVar181 * auVar77._8_4_;
          auVar286._12_4_ = fVar181 * auVar77._12_4_;
          auVar271._0_4_ = fVar181 * auVar116._0_4_;
          auVar271._4_4_ = fVar181 * auVar116._4_4_;
          auVar271._8_4_ = fVar181 * auVar116._8_4_;
          auVar271._12_4_ = fVar181 * auVar116._12_4_;
          auVar74 = vinsertps_avx(auVar12,auVar147,0x10);
          auVar75 = vinsertps_avx(auVar87,auVar166,0x10);
          auVar86._0_4_ = (auVar74._0_4_ + auVar75._0_4_) * 0.5;
          auVar86._4_4_ = (auVar74._4_4_ + auVar75._4_4_) * 0.5;
          auVar86._8_4_ = (auVar74._8_4_ + auVar75._8_4_) * 0.5;
          auVar86._12_4_ = (auVar74._12_4_ + auVar75._12_4_) * 0.5;
          auVar139._4_4_ = auVar86._0_4_;
          auVar139._0_4_ = auVar86._0_4_;
          auVar139._8_4_ = auVar86._0_4_;
          auVar139._12_4_ = auVar86._0_4_;
          auVar116 = vfmadd213ps_fma(local_278,auVar139,auVar13);
          auVar76 = vfmadd213ps_fma(local_288,auVar139,auVar14);
          auVar77 = vfmadd213ps_fma(local_298,auVar139,auVar15);
          auVar87 = vsubps_avx(auVar76,auVar116);
          auVar116 = vfmadd213ps_fma(auVar87,auVar139,auVar116);
          auVar87 = vsubps_avx(auVar77,auVar76);
          auVar87 = vfmadd213ps_fma(auVar87,auVar139,auVar76);
          auVar87 = vsubps_avx(auVar87,auVar116);
          auVar116 = vfmadd231ps_fma(auVar116,auVar87,auVar139);
          auVar140._0_8_ = CONCAT44(auVar87._4_4_ * 3.0,auVar87._0_4_ * 3.0);
          auVar140._8_4_ = auVar87._8_4_ * 3.0;
          auVar140._12_4_ = auVar87._12_4_ * 3.0;
          auVar260._8_8_ = auVar116._0_8_;
          auVar260._0_8_ = auVar116._0_8_;
          auVar87 = vshufpd_avx(auVar116,auVar116,3);
          auVar116 = vshufps_avx(auVar86,auVar86,0x55);
          auVar240 = vsubps_avx(auVar87,auVar260);
          auVar109 = vfmadd231ps_fma(auVar260,auVar116,auVar240);
          auVar310._8_8_ = auVar140._0_8_;
          auVar310._0_8_ = auVar140._0_8_;
          auVar87 = vshufpd_avx(auVar140,auVar140,3);
          auVar87 = vsubps_avx(auVar87,auVar310);
          auVar108 = vfmadd213ps_fma(auVar87,auVar116,auVar310);
          auVar116 = vmovshdup_avx(auVar108);
          auVar311._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
          auVar311._8_4_ = auVar116._8_4_ ^ 0x80000000;
          auVar311._12_4_ = auVar116._12_4_ ^ 0x80000000;
          auVar76 = vmovshdup_avx(auVar240);
          auVar87 = vunpcklps_avx(auVar76,auVar311);
          auVar77 = vshufps_avx(auVar87,auVar311,4);
          auVar333._0_8_ = auVar240._0_8_ ^ 0x8000000080000000;
          auVar333._8_4_ = auVar240._8_4_ ^ 0x80000000;
          auVar333._12_4_ = auVar240._12_4_ ^ 0x80000000;
          auVar87 = vmovlhps_avx(auVar333,auVar108);
          auVar87 = vshufps_avx(auVar87,auVar108,8);
          auVar116 = vfmsub231ss_fma(ZEXT416((uint)(auVar116._0_4_ * auVar240._0_4_)),auVar76,
                                     auVar108);
          auVar157._0_4_ = auVar116._0_4_;
          auVar157._4_4_ = auVar157._0_4_;
          auVar157._8_4_ = auVar157._0_4_;
          auVar157._12_4_ = auVar157._0_4_;
          auVar116 = vdivps_avx(auVar77,auVar157);
          auVar76 = vdivps_avx(auVar87,auVar157);
          fVar107 = auVar109._0_4_;
          fVar181 = auVar116._0_4_;
          auVar87 = vshufps_avx(auVar109,auVar109,0x55);
          fVar182 = auVar76._0_4_;
          local_658._4_4_ = fVar107 * auVar116._4_4_ + auVar87._4_4_ * auVar76._4_4_;
          local_658._0_4_ = fVar107 * fVar181 + auVar87._0_4_ * fVar182;
          uStack_650._0_4_ = fVar107 * auVar116._8_4_ + auVar87._8_4_ * auVar76._8_4_;
          uStack_650._4_4_ = fVar107 * auVar116._12_4_ + auVar87._12_4_ * auVar76._12_4_;
          auVar240 = vmovshdup_avx(auVar116);
          auVar87 = vinsertps_avx(auVar243,auVar286,0x1c);
          auVar324._0_4_ = auVar240._0_4_ * auVar87._0_4_;
          auVar324._4_4_ = auVar240._4_4_ * auVar87._4_4_;
          auVar324._8_4_ = auVar240._8_4_ * auVar87._8_4_;
          auVar324._12_4_ = auVar240._12_4_ * auVar87._12_4_;
          auVar77 = vinsertps_avx(auVar224,auVar271,0x1c);
          auVar297._0_4_ = auVar240._0_4_ * auVar77._0_4_;
          auVar297._4_4_ = auVar240._4_4_ * auVar77._4_4_;
          auVar297._8_4_ = auVar240._8_4_ * auVar77._8_4_;
          auVar297._12_4_ = auVar240._12_4_ * auVar77._12_4_;
          auVar78 = vminps_avx(auVar324,auVar297);
          auVar109 = vmaxps_avx(auVar297,auVar324);
          auVar240 = vinsertps_avx(auVar286,auVar243,0x4c);
          auVar152 = vmovshdup_avx(auVar76);
          auVar108 = vinsertps_avx(auVar271,auVar224,0x4c);
          auVar272._0_4_ = auVar152._0_4_ * auVar240._0_4_;
          auVar272._4_4_ = auVar152._4_4_ * auVar240._4_4_;
          auVar272._8_4_ = auVar152._8_4_ * auVar240._8_4_;
          auVar272._12_4_ = auVar152._12_4_ * auVar240._12_4_;
          auVar287._0_4_ = auVar152._0_4_ * auVar108._0_4_;
          auVar287._4_4_ = auVar152._4_4_ * auVar108._4_4_;
          auVar287._8_4_ = auVar152._8_4_ * auVar108._8_4_;
          auVar287._12_4_ = auVar152._12_4_ * auVar108._12_4_;
          auVar152 = vminps_avx(auVar272,auVar287);
          auVar100._0_4_ = auVar152._0_4_ + auVar78._0_4_;
          auVar100._4_4_ = auVar152._4_4_ + auVar78._4_4_;
          auVar100._8_4_ = auVar152._8_4_ + auVar78._8_4_;
          auVar100._12_4_ = auVar152._12_4_ + auVar78._12_4_;
          auVar78 = vmaxps_avx(auVar287,auVar272);
          auVar273._0_4_ = auVar109._0_4_ + auVar78._0_4_;
          auVar273._4_4_ = auVar109._4_4_ + auVar78._4_4_;
          auVar273._8_4_ = auVar109._8_4_ + auVar78._8_4_;
          auVar273._12_4_ = auVar109._12_4_ + auVar78._12_4_;
          auVar288._8_8_ = 0x3f80000000000000;
          auVar288._0_8_ = 0x3f80000000000000;
          auVar109 = vsubps_avx(auVar288,auVar273);
          auVar78 = vsubps_avx(auVar288,auVar100);
          auVar152 = vsubps_avx(auVar74,auVar86);
          auVar312._0_4_ = fVar181 * auVar87._0_4_;
          auVar312._4_4_ = fVar181 * auVar87._4_4_;
          auVar312._8_4_ = fVar181 * auVar87._8_4_;
          auVar312._12_4_ = fVar181 * auVar87._12_4_;
          auVar298._0_4_ = fVar181 * auVar77._0_4_;
          auVar298._4_4_ = fVar181 * auVar77._4_4_;
          auVar298._8_4_ = fVar181 * auVar77._8_4_;
          auVar298._12_4_ = fVar181 * auVar77._12_4_;
          auVar77 = vminps_avx(auVar312,auVar298);
          auVar87 = vmaxps_avx(auVar298,auVar312);
          auVar244._0_4_ = fVar182 * auVar240._0_4_;
          auVar244._4_4_ = fVar182 * auVar240._4_4_;
          auVar244._8_4_ = fVar182 * auVar240._8_4_;
          auVar244._12_4_ = fVar182 * auVar240._12_4_;
          auVar225._0_4_ = fVar182 * auVar108._0_4_;
          auVar225._4_4_ = fVar182 * auVar108._4_4_;
          auVar225._8_4_ = fVar182 * auVar108._8_4_;
          auVar225._12_4_ = fVar182 * auVar108._12_4_;
          auVar240 = vminps_avx(auVar244,auVar225);
          auVar313._0_4_ = auVar77._0_4_ + auVar240._0_4_;
          auVar313._4_4_ = auVar77._4_4_ + auVar240._4_4_;
          auVar313._8_4_ = auVar77._8_4_ + auVar240._8_4_;
          auVar313._12_4_ = auVar77._12_4_ + auVar240._12_4_;
          auVar240 = vsubps_avx(auVar75,auVar86);
          auVar77 = vmaxps_avx(auVar225,auVar244);
          fVar107 = auVar152._0_4_;
          auVar245._0_4_ = fVar107 * auVar109._0_4_;
          fVar125 = auVar152._4_4_;
          auVar245._4_4_ = fVar125 * auVar109._4_4_;
          fVar126 = auVar152._8_4_;
          auVar245._8_4_ = fVar126 * auVar109._8_4_;
          fVar127 = auVar152._12_4_;
          auVar245._12_4_ = fVar127 * auVar109._12_4_;
          auVar226._0_4_ = auVar87._0_4_ + auVar77._0_4_;
          auVar226._4_4_ = auVar87._4_4_ + auVar77._4_4_;
          auVar226._8_4_ = auVar87._8_4_ + auVar77._8_4_;
          auVar226._12_4_ = auVar87._12_4_ + auVar77._12_4_;
          auVar299._8_8_ = 0x3f800000;
          auVar299._0_8_ = 0x3f800000;
          auVar87 = vsubps_avx(auVar299,auVar226);
          auVar77 = vsubps_avx(auVar299,auVar313);
          auVar314._0_4_ = fVar107 * auVar78._0_4_;
          auVar314._4_4_ = fVar125 * auVar78._4_4_;
          auVar314._8_4_ = fVar126 * auVar78._8_4_;
          auVar314._12_4_ = fVar127 * auVar78._12_4_;
          fVar183 = auVar240._0_4_;
          auVar274._0_4_ = fVar183 * auVar109._0_4_;
          fVar184 = auVar240._4_4_;
          auVar274._4_4_ = fVar184 * auVar109._4_4_;
          fVar146 = auVar240._8_4_;
          auVar274._8_4_ = fVar146 * auVar109._8_4_;
          fVar162 = auVar240._12_4_;
          auVar274._12_4_ = fVar162 * auVar109._12_4_;
          auVar101._0_4_ = fVar183 * auVar78._0_4_;
          auVar101._4_4_ = fVar184 * auVar78._4_4_;
          auVar101._8_4_ = fVar146 * auVar78._8_4_;
          auVar101._12_4_ = fVar162 * auVar78._12_4_;
          auVar334._0_4_ = fVar107 * auVar87._0_4_;
          auVar334._4_4_ = fVar125 * auVar87._4_4_;
          auVar334._8_4_ = fVar126 * auVar87._8_4_;
          auVar334._12_4_ = fVar127 * auVar87._12_4_;
          auVar289._0_4_ = fVar107 * auVar77._0_4_;
          auVar289._4_4_ = fVar125 * auVar77._4_4_;
          auVar289._8_4_ = fVar126 * auVar77._8_4_;
          auVar289._12_4_ = fVar127 * auVar77._12_4_;
          auVar227._0_4_ = fVar183 * auVar87._0_4_;
          auVar227._4_4_ = fVar184 * auVar87._4_4_;
          auVar227._8_4_ = fVar146 * auVar87._8_4_;
          auVar227._12_4_ = fVar162 * auVar87._12_4_;
          auVar300._0_4_ = fVar183 * auVar77._0_4_;
          auVar300._4_4_ = fVar184 * auVar77._4_4_;
          auVar300._8_4_ = fVar146 * auVar77._8_4_;
          auVar300._12_4_ = fVar162 * auVar77._12_4_;
          auVar87 = vminps_avx(auVar334,auVar289);
          auVar77 = vminps_avx(auVar227,auVar300);
          auVar87 = vminps_avx(auVar87,auVar77);
          auVar77 = vmaxps_avx(auVar289,auVar334);
          auVar240 = vminps_avx(auVar245,auVar314);
          auVar108 = vminps_avx(auVar274,auVar101);
          auVar240 = vminps_avx(auVar240,auVar108);
          auVar87 = vhaddps_avx(auVar87,auVar240);
          auVar240 = vmaxps_avx(auVar300,auVar227);
          auVar77 = vmaxps_avx(auVar240,auVar77);
          auVar240 = vmaxps_avx(auVar314,auVar245);
          auVar108 = vmaxps_avx(auVar101,auVar274);
          auVar240 = vmaxps_avx(auVar108,auVar240);
          auVar77 = vhaddps_avx(auVar77,auVar240);
          auVar240 = vshufps_avx(auVar86,auVar86,0x54);
          auVar240 = vsubps_avx(auVar240,_local_658);
          auVar87 = vshufps_avx(auVar87,auVar87,0xe8);
          auVar77 = vshufps_avx(auVar77,auVar77,0xe8);
          auVar246._0_4_ = auVar240._0_4_ + auVar87._0_4_;
          auVar246._4_4_ = auVar240._4_4_ + auVar87._4_4_;
          auVar246._8_4_ = auVar240._8_4_ + auVar87._8_4_;
          auVar246._12_4_ = auVar240._12_4_ + auVar87._12_4_;
          auVar228._0_4_ = auVar240._0_4_ + auVar77._0_4_;
          auVar228._4_4_ = auVar240._4_4_ + auVar77._4_4_;
          auVar228._8_4_ = auVar240._8_4_ + auVar77._8_4_;
          auVar228._12_4_ = auVar240._12_4_ + auVar77._12_4_;
          auVar87 = vmaxps_avx(auVar74,auVar246);
          auVar77 = vminps_avx(auVar228,auVar75);
          auVar87 = vcmpps_avx(auVar77,auVar87,1);
          auVar87 = vshufps_avx(auVar87,auVar87,0x50);
          local_668 = vinsertps_avx(auVar147,ZEXT416((uint)auVar166._0_4_),0x10);
          if ((auVar87 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar87[0xf] < '\0') goto LAB_01763aa7;
          bVar66 = 0;
          if ((auVar206._0_4_ < auVar246._0_4_) && (bVar66 = 0, auVar228._0_4_ < auVar75._0_4_)) {
            auVar77 = vmovshdup_avx(auVar246);
            auVar87 = vcmpps_avx(auVar228,auVar75,1);
            bVar66 = auVar87[4] & auVar147._0_4_ < auVar77._0_4_;
          }
          if (((3 < (uint)uVar63 || fVar165 < 0.001) | bVar66) == 1) {
            lVar65 = 200;
            do {
              fVar126 = auVar240._0_4_;
              fVar125 = 1.0 - fVar126;
              fVar165 = fVar125 * fVar125 * fVar125;
              fVar107 = fVar126 * 3.0 * fVar125 * fVar125;
              fVar125 = fVar125 * fVar126 * fVar126 * 3.0;
              auVar177._4_4_ = fVar165;
              auVar177._0_4_ = fVar165;
              auVar177._8_4_ = fVar165;
              auVar177._12_4_ = fVar165;
              auVar118._4_4_ = fVar107;
              auVar118._0_4_ = fVar107;
              auVar118._8_4_ = fVar107;
              auVar118._12_4_ = fVar107;
              auVar102._4_4_ = fVar125;
              auVar102._0_4_ = fVar125;
              auVar102._8_4_ = fVar125;
              auVar102._12_4_ = fVar125;
              fVar126 = fVar126 * fVar126 * fVar126;
              auVar202._0_4_ = (float)local_418._0_4_ * fVar126;
              auVar202._4_4_ = (float)local_418._4_4_ * fVar126;
              auVar202._8_4_ = fStack_410 * fVar126;
              auVar202._12_4_ = fStack_40c * fVar126;
              auVar87 = vfmadd231ps_fma(auVar202,auVar15,auVar102);
              auVar87 = vfmadd231ps_fma(auVar87,auVar14,auVar118);
              auVar87 = vfmadd231ps_fma(auVar87,auVar13,auVar177);
              auVar103._8_8_ = auVar87._0_8_;
              auVar103._0_8_ = auVar87._0_8_;
              auVar87 = vshufpd_avx(auVar87,auVar87,3);
              auVar77 = vshufps_avx(auVar240,auVar240,0x55);
              auVar87 = vsubps_avx(auVar87,auVar103);
              auVar77 = vfmadd213ps_fma(auVar87,auVar77,auVar103);
              fVar165 = auVar77._0_4_;
              auVar87 = vshufps_avx(auVar77,auVar77,0x55);
              auVar104._0_4_ = fVar181 * fVar165 + fVar182 * auVar87._0_4_;
              auVar104._4_4_ = auVar116._4_4_ * fVar165 + auVar76._4_4_ * auVar87._4_4_;
              auVar104._8_4_ = auVar116._8_4_ * fVar165 + auVar76._8_4_ * auVar87._8_4_;
              auVar104._12_4_ = auVar116._12_4_ * fVar165 + auVar76._12_4_ * auVar87._12_4_;
              auVar240 = vsubps_avx(auVar240,auVar104);
              auVar87 = vandps_avx(auVar320,auVar77);
              auVar77 = vshufps_avx(auVar87,auVar87,0xf5);
              auVar87 = vmaxss_avx(auVar77,auVar87);
              if (auVar87._0_4_ < (float)local_2a8._0_4_) {
                local_1f8 = auVar240._0_4_;
                if ((0.0 <= local_1f8) && (local_1f8 <= 1.0)) {
                  auVar87 = vmovshdup_avx(auVar240);
                  fVar165 = auVar87._0_4_;
                  if ((0.0 <= fVar165) && (fVar165 <= 1.0)) {
                    auVar87 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar109 = vinsertps_avx(auVar87,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar87 = vdpps_avx(auVar109,local_428,0x7f);
                    auVar116 = vdpps_avx(auVar109,local_438,0x7f);
                    auVar76 = vdpps_avx(auVar109,local_2b8,0x7f);
                    auVar77 = vdpps_avx(auVar109,local_2c8,0x7f);
                    auVar74 = vdpps_avx(auVar109,local_2d8,0x7f);
                    auVar75 = vdpps_avx(auVar109,local_2e8,0x7f);
                    auVar108 = vdpps_avx(auVar109,local_2f8,0x7f);
                    auVar109 = vdpps_avx(auVar109,local_308,0x7f);
                    fVar181 = 1.0 - fVar165;
                    auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * auVar74._0_4_)),
                                              ZEXT416((uint)fVar181),auVar87);
                    auVar116 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar165)),
                                               ZEXT416((uint)fVar181),auVar116);
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar108._0_4_ * fVar165)),
                                              ZEXT416((uint)fVar181),auVar76);
                    auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * auVar109._0_4_)),
                                              ZEXT416((uint)fVar181),auVar77);
                    fVar107 = 1.0 - local_1f8;
                    fVar165 = fVar107 * local_1f8 * local_1f8 * 3.0;
                    fVar126 = local_1f8 * local_1f8 * local_1f8;
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ * fVar126)),
                                              ZEXT416((uint)fVar165),auVar76);
                    fVar181 = local_1f8 * 3.0 * fVar107 * fVar107;
                    auVar116 = vfmadd231ss_fma(auVar76,ZEXT416((uint)fVar181),auVar116);
                    fVar182 = fVar107 * fVar107 * fVar107;
                    auVar87 = vfmadd231ss_fma(auVar116,ZEXT416((uint)fVar182),auVar87);
                    fVar125 = auVar87._0_4_;
                    if ((fVar72 <= fVar125) &&
                       (fVar127 = *(float *)(ray + k * 4 + 0x80), fVar125 <= fVar127)) {
                      pGVar5 = (context->scene->geometries).items[uVar62].ptr;
                      if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar71 = false;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar71 = true, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0))
                      {
                        local_1e8 = vshufps_avx(auVar240,auVar240,0x55);
                        auVar247._8_4_ = 0x3f800000;
                        auVar247._0_8_ = &DAT_3f8000003f800000;
                        auVar247._12_4_ = 0x3f800000;
                        auVar87 = vsubps_avx(auVar247,local_1e8);
                        fVar183 = local_1e8._0_4_;
                        auVar261._0_4_ = fVar183 * (float)local_468._0_4_;
                        fVar184 = local_1e8._4_4_;
                        auVar261._4_4_ = fVar184 * (float)local_468._4_4_;
                        fVar146 = local_1e8._8_4_;
                        auVar261._8_4_ = fVar146 * fStack_460;
                        fVar162 = local_1e8._12_4_;
                        auVar261._12_4_ = fVar162 * fStack_45c;
                        auVar275._0_4_ = fVar183 * (float)local_478._0_4_;
                        auVar275._4_4_ = fVar184 * (float)local_478._4_4_;
                        auVar275._8_4_ = fVar146 * fStack_470;
                        auVar275._12_4_ = fVar162 * fStack_46c;
                        local_4e8 = auVar190._0_4_;
                        fStack_4e4 = auVar190._4_4_;
                        fStack_4e0 = auVar190._8_4_;
                        fStack_4dc = auVar190._12_4_;
                        auVar290._0_4_ = fVar183 * local_4e8;
                        auVar290._4_4_ = fVar184 * fStack_4e4;
                        auVar290._8_4_ = fVar146 * fStack_4e0;
                        auVar290._12_4_ = fVar162 * fStack_4dc;
                        local_4f8 = auVar17._0_4_;
                        fStack_4f4 = auVar17._4_4_;
                        fStack_4f0 = auVar17._8_4_;
                        fStack_4ec = auVar17._12_4_;
                        auVar301._0_4_ = fVar183 * local_4f8;
                        auVar301._4_4_ = fVar184 * fStack_4f4;
                        auVar301._8_4_ = fVar146 * fStack_4f0;
                        auVar301._12_4_ = fVar162 * fStack_4ec;
                        auVar116 = vfmadd231ps_fma(auVar261,auVar87,local_448);
                        auVar76 = vfmadd231ps_fma(auVar275,auVar87,auVar16);
                        auVar77 = vfmadd231ps_fma(auVar290,auVar87,local_458);
                        auVar74 = vfmadd231ps_fma(auVar301,auVar87,auVar131);
                        auVar87 = vsubps_avx(auVar76,auVar116);
                        auVar116 = vsubps_avx(auVar77,auVar76);
                        auVar76 = vsubps_avx(auVar74,auVar77);
                        auVar291._0_4_ = auVar116._0_4_ * local_1f8;
                        auVar291._4_4_ = auVar116._4_4_ * local_1f8;
                        auVar291._8_4_ = auVar116._8_4_ * local_1f8;
                        auVar291._12_4_ = auVar116._12_4_ * local_1f8;
                        auVar203._4_4_ = fVar107;
                        auVar203._0_4_ = fVar107;
                        auVar203._8_4_ = fVar107;
                        auVar203._12_4_ = fVar107;
                        auVar87 = vfmadd231ps_fma(auVar291,auVar203,auVar87);
                        auVar248._0_4_ = auVar76._0_4_ * local_1f8;
                        auVar248._4_4_ = auVar76._4_4_ * local_1f8;
                        auVar248._8_4_ = auVar76._8_4_ * local_1f8;
                        auVar248._12_4_ = auVar76._12_4_ * local_1f8;
                        auVar116 = vfmadd231ps_fma(auVar248,auVar203,auVar116);
                        auVar249._0_4_ = auVar116._0_4_ * local_1f8;
                        auVar249._4_4_ = auVar116._4_4_ * local_1f8;
                        auVar249._8_4_ = auVar116._8_4_ * local_1f8;
                        auVar249._12_4_ = auVar116._12_4_ * local_1f8;
                        auVar116 = vfmadd231ps_fma(auVar249,auVar203,auVar87);
                        auVar178._0_4_ = fVar126 * (float)local_388._0_4_;
                        auVar178._4_4_ = fVar126 * (float)local_388._4_4_;
                        auVar178._8_4_ = fVar126 * fStack_380;
                        auVar178._12_4_ = fVar126 * fStack_37c;
                        auVar119._4_4_ = fVar165;
                        auVar119._0_4_ = fVar165;
                        auVar119._8_4_ = fVar165;
                        auVar119._12_4_ = fVar165;
                        auVar87 = vfmadd132ps_fma(auVar119,auVar178,local_378);
                        auVar158._4_4_ = fVar181;
                        auVar158._0_4_ = fVar181;
                        auVar158._8_4_ = fVar181;
                        auVar158._12_4_ = fVar181;
                        auVar87 = vfmadd132ps_fma(auVar158,auVar87,local_368);
                        auVar120._0_4_ = auVar116._0_4_ * 3.0;
                        auVar120._4_4_ = auVar116._4_4_ * 3.0;
                        auVar120._8_4_ = auVar116._8_4_ * 3.0;
                        auVar120._12_4_ = auVar116._12_4_ * 3.0;
                        auVar141._4_4_ = fVar182;
                        auVar141._0_4_ = fVar182;
                        auVar141._8_4_ = fVar182;
                        auVar141._12_4_ = fVar182;
                        auVar116 = vfmadd132ps_fma(auVar141,auVar87,local_358);
                        auVar87 = vshufps_avx(auVar120,auVar120,0xc9);
                        auVar159._0_4_ = auVar116._0_4_ * auVar87._0_4_;
                        auVar159._4_4_ = auVar116._4_4_ * auVar87._4_4_;
                        auVar159._8_4_ = auVar116._8_4_ * auVar87._8_4_;
                        auVar159._12_4_ = auVar116._12_4_ * auVar87._12_4_;
                        auVar87 = vshufps_avx(auVar116,auVar116,0xc9);
                        auVar116 = vfmsub231ps_fma(auVar159,auVar120,auVar87);
                        auVar87 = vshufps_avx(auVar116,auVar116,0x55);
                        local_228[0] = (RTCHitN)auVar87[0];
                        local_228[1] = (RTCHitN)auVar87[1];
                        local_228[2] = (RTCHitN)auVar87[2];
                        local_228[3] = (RTCHitN)auVar87[3];
                        local_228[4] = (RTCHitN)auVar87[4];
                        local_228[5] = (RTCHitN)auVar87[5];
                        local_228[6] = (RTCHitN)auVar87[6];
                        local_228[7] = (RTCHitN)auVar87[7];
                        local_228[8] = (RTCHitN)auVar87[8];
                        local_228[9] = (RTCHitN)auVar87[9];
                        local_228[10] = (RTCHitN)auVar87[10];
                        local_228[0xb] = (RTCHitN)auVar87[0xb];
                        local_228[0xc] = (RTCHitN)auVar87[0xc];
                        local_228[0xd] = (RTCHitN)auVar87[0xd];
                        local_228[0xe] = (RTCHitN)auVar87[0xe];
                        local_228[0xf] = (RTCHitN)auVar87[0xf];
                        local_218 = vshufps_avx(auVar116,auVar116,0xaa);
                        local_208 = auVar116._0_4_;
                        uStack_204 = local_208;
                        uStack_200 = local_208;
                        uStack_1fc = local_208;
                        fStack_1f4 = local_1f8;
                        fStack_1f0 = local_1f8;
                        fStack_1ec = local_1f8;
                        local_1d8 = CONCAT44(uStack_344,local_348);
                        uStack_1d0 = CONCAT44(uStack_33c,uStack_340);
                        local_1c8._4_4_ = uStack_334;
                        local_1c8._0_4_ = local_338;
                        local_1c8._8_4_ = uStack_330;
                        local_1c8._12_4_ = uStack_32c;
                        vpcmpeqd_avx2(ZEXT1632(local_1c8),ZEXT1632(local_1c8));
                        uStack_1b4 = context->user->instID[0];
                        local_1b8 = uStack_1b4;
                        uStack_1b0 = uStack_1b4;
                        uStack_1ac = uStack_1b4;
                        uStack_1a8 = context->user->instPrimID[0];
                        uStack_1a4 = uStack_1a8;
                        uStack_1a0 = uStack_1a8;
                        uStack_19c = uStack_1a8;
                        *(float *)(ray + k * 4 + 0x80) = fVar125;
                        local_498 = *local_488;
                        uStack_490 = local_488[1];
                        local_3d8.valid = (int *)&local_498;
                        local_3d8.geometryUserPtr = pGVar5->userPtr;
                        local_3d8.context = context->user;
                        local_3d8.ray = (RTCRayN *)ray;
                        local_3d8.hit = local_228;
                        local_3d8.N = 4;
                        local_3a8._0_4_ = (int)uVar69;
                        if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar5->occlusionFilterN)(&local_3d8);
                          uVar69 = (ulong)(uint)local_3a8._0_4_;
                        }
                        auVar53._8_8_ = uStack_490;
                        auVar53._0_8_ = local_498;
                        if (auVar53 == (undefined1  [16])0x0) {
                          auVar87 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar87 = auVar87 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var11)(&local_3d8);
                            uVar69 = (ulong)(uint)local_3a8._0_4_;
                          }
                          auVar54._8_8_ = uStack_490;
                          auVar54._0_8_ = local_498;
                          auVar116 = vpcmpeqd_avx((undefined1  [16])0x0,auVar54);
                          auVar87 = auVar116 ^ _DAT_01febe20;
                          auVar121._8_4_ = 0xff800000;
                          auVar121._0_8_ = 0xff800000ff800000;
                          auVar121._12_4_ = 0xff800000;
                          auVar116 = vblendvps_avx(auVar121,*(undefined1 (*) [16])
                                                             (local_3d8.ray + 0x80),auVar116);
                          *(undefined1 (*) [16])(local_3d8.ray + 0x80) = auVar116;
                        }
                        auVar87 = vpslld_avx(auVar87,0x1f);
                        iVar61 = vmovmskps_avx(auVar87);
                        if (iVar61 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar127;
                        }
                        bVar71 = (char)iVar61 != '\0';
                      }
                      uVar69 = CONCAT71((int7)(uVar69 >> 8),(byte)uVar69 | bVar71);
                    }
                  }
                }
                break;
              }
              lVar65 = lVar65 + -1;
            } while (lVar65 != 0);
          }
          else {
            bVar47 = false;
          }
        }
      }
    } while (bVar47);
    local_318 = vinsertps_avx(auVar12,ZEXT416((uint)fVar180),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }